

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3333.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementBeamANCF_3333::ComputeInternalForcesContIntDamping
          (ChElementBeamANCF_3333 *this,ChVectorDynamic<> *Fi)

{
  Matrix<double,__1,__1,_1,__1,__1> *a_lhs;
  double *pdVar1;
  double dVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  undefined1 (*pauVar5) [32];
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  void *pvVar47;
  undefined8 *puVar48;
  double *pdVar49;
  char *pcVar50;
  Index index;
  ulong uVar51;
  long lVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  double dVar90;
  double dVar91;
  double dVar93;
  double dVar94;
  double dVar95;
  double dVar96;
  double dVar97;
  double dVar98;
  undefined1 auVar92 [32];
  double dVar99;
  double dVar101;
  double dVar102;
  undefined1 auVar100 [32];
  double dVar103;
  undefined1 auVar104 [32];
  undefined1 auVar105 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  double dVar109;
  double dVar112;
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  double dVar113;
  double dVar114;
  double dVar115;
  double dVar116;
  double dVar117;
  double dVar118;
  double dVar119;
  double dVar120;
  double dVar121;
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [16];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  ChMatrixNMc<double,_3_*_NIP,_6> FC;
  ChMatrixNMc<double,_3_*_NIP,_3> P_Block;
  MatrixNx3 QiCompact;
  MatrixNx6 ebar_ebardot;
  double local_1798;
  undefined1 local_1698 [16];
  double dStack_1688;
  double dStack_1680;
  double local_1678;
  double local_1658;
  double local_1638;
  Scalar local_15f0;
  double local_15e8;
  double dStack_15e0;
  double dStack_15d8;
  double dStack_15d0;
  undefined1 local_15c8 [32];
  undefined1 local_15a8 [16];
  double dStack_1598;
  double dStack_1590;
  double local_1588;
  double dStack_1580;
  double dStack_1578;
  double dStack_1570;
  undefined1 local_1568 [32];
  undefined1 local_1548 [32];
  undefined1 local_1528 [32];
  double local_1508;
  double dStack_1500;
  double dStack_14f8;
  double dStack_14f0;
  double local_14e8;
  double dStack_14e0;
  double dStack_14d8;
  double dStack_14d0;
  double local_14c8;
  double dStack_14c0;
  double dStack_14b8;
  double dStack_14b0;
  double local_14a8;
  double dStack_14a0;
  double dStack_1498;
  double dStack_1490;
  double local_1488;
  double dStack_1480;
  double dStack_1478;
  double dStack_1470;
  double local_1468;
  double dStack_1460;
  double dStack_1458;
  double dStack_1450;
  double local_1448;
  double dStack_1440;
  double dStack_1438;
  double dStack_1430;
  double local_1428;
  double dStack_1420;
  double dStack_1418;
  double dStack_1410;
  double local_1408;
  double dStack_1400;
  double dStack_13f8;
  double dStack_13f0;
  double local_13e8;
  double dStack_13e0;
  double dStack_13d8;
  double dStack_13d0;
  double local_13c8;
  double dStack_13c0;
  double dStack_13b8;
  double dStack_13b0;
  double local_13a8;
  double dStack_13a0;
  double dStack_1398;
  double dStack_1390;
  double local_1388;
  double dStack_1380;
  double dStack_1378;
  double dStack_1370;
  double local_1368;
  double dStack_1360;
  double dStack_1358;
  double dStack_1350;
  undefined1 local_1348 [32];
  undefined1 local_1328 [32];
  undefined1 local_1308 [32];
  undefined1 local_12e8 [32];
  undefined1 local_12c8 [32];
  undefined1 local_12a8 [32];
  undefined1 local_1288 [32];
  undefined1 local_1268 [32];
  double local_1248;
  double dStack_1240;
  double dStack_1238;
  double dStack_1230;
  double local_1228;
  double dStack_1220;
  double dStack_1218;
  double dStack_1210;
  double local_1208;
  double dStack_1200;
  double dStack_11f8;
  double dStack_11f0;
  double local_11e8;
  double dStack_11e0;
  double dStack_11d8;
  double dStack_11d0;
  double local_11c8;
  double dStack_11c0;
  double dStack_11b8;
  double dStack_11b0;
  double local_11a8;
  double dStack_11a0;
  double dStack_1198;
  double dStack_1190;
  double local_1188;
  double dStack_1180;
  double dStack_1178;
  double dStack_1170;
  double local_1168;
  double dStack_1160;
  double dStack_1158;
  double dStack_1150;
  double local_1148;
  double dStack_1140;
  double dStack_1138;
  double dStack_1130;
  double local_1128;
  double dStack_1120;
  double dStack_1118;
  double dStack_1110;
  double local_1108;
  double dStack_1100;
  double dStack_10f8;
  double dStack_10f0;
  double local_10e8;
  double dStack_10e0;
  double dStack_10d8;
  double dStack_10d0;
  double local_10c8;
  double dStack_10c0;
  double dStack_10b8;
  double dStack_10b0;
  double local_10a8;
  double dStack_10a0;
  double dStack_1098;
  double dStack_1090;
  double local_1088;
  double dStack_1080;
  double dStack_1078;
  double dStack_1070;
  double local_1068;
  double dStack_1060;
  double dStack_1058;
  double dStack_1050;
  double local_1048;
  double dStack_1040;
  double dStack_1038;
  double dStack_1030;
  double local_1028;
  double dStack_1020;
  double dStack_1018;
  double dStack_1010;
  double local_1008;
  double dStack_1000;
  double dStack_ff8;
  double dStack_ff0;
  double local_fe8;
  double dStack_fe0;
  double dStack_fd8;
  double dStack_fd0;
  double local_fc8;
  double dStack_fc0;
  double dStack_fb8;
  double dStack_fb0;
  double local_fa8;
  double dStack_fa0;
  double dStack_f98;
  double dStack_f90;
  double local_f88;
  double dStack_f80;
  double dStack_f78;
  double dStack_f70;
  undefined1 local_f68 [160];
  double local_ec8;
  double dStack_ec0;
  double dStack_eb8;
  double dStack_eb0;
  undefined1 local_ea8 [32];
  undefined1 local_e88 [32];
  undefined1 local_e68 [32];
  double local_e48;
  double dStack_e40;
  double local_e38;
  double local_e30;
  double dStack_e28;
  double local_e20;
  double local_e18;
  double dStack_e10;
  double local_e08;
  double local_e00;
  double dStack_df8;
  double dStack_df0;
  double dStack_de8;
  double local_de0;
  double dStack_dd8;
  double dStack_dd0;
  double dStack_dc8;
  double local_dc0;
  double dStack_db8;
  double dStack_db0;
  double dStack_da8;
  double local_da0;
  double dStack_d98;
  double dStack_d90;
  double dStack_d88;
  double local_d80;
  double dStack_d78;
  double dStack_d70;
  double dStack_d68;
  double local_d60;
  double dStack_d58;
  double dStack_d50;
  double dStack_d48;
  undefined1 local_d40 [32];
  undefined1 local_d20 [32];
  undefined1 local_d00 [32];
  double local_ce0;
  double dStack_cd8;
  double local_cd0;
  double local_cc8;
  double dStack_cc0;
  double local_cb8;
  double local_cb0;
  double dStack_ca8;
  double local_ca0;
  double local_c98;
  double dStack_c90;
  double dStack_c88;
  double dStack_c80;
  double local_c78;
  double dStack_c70;
  double dStack_c68;
  double dStack_c60;
  double local_c58;
  double dStack_c50;
  double dStack_c48;
  double dStack_c40;
  double local_c38;
  double dStack_c30;
  double dStack_c28;
  double dStack_c20;
  undefined1 local_c18 [32];
  double local_bf8;
  double dStack_bf0;
  double dStack_be8;
  double dStack_be0;
  undefined1 local_bd8 [32];
  undefined1 local_bb8 [32];
  undefined1 local_b98 [32];
  double local_b78;
  double dStack_b70;
  double local_b68;
  double local_b60;
  double dStack_b58;
  double local_b50;
  double local_b48;
  double dStack_b40;
  double local_b38;
  double local_b30;
  double dStack_b28;
  double dStack_b20;
  double dStack_b18;
  double local_b10;
  double dStack_b08;
  double dStack_b00;
  double dStack_af8;
  double local_af0;
  double dStack_ae8;
  double dStack_ae0;
  double dStack_ad8;
  double local_ad0;
  double dStack_ac8;
  double dStack_ac0;
  double dStack_ab8;
  double local_ab0;
  double dStack_aa8;
  double dStack_aa0;
  double dStack_a98;
  double local_a90;
  double dStack_a88;
  double dStack_a80;
  double dStack_a78;
  undefined1 local_a70 [32];
  undefined1 local_a50 [32];
  undefined1 local_a30 [32];
  double local_a10;
  double dStack_a08;
  double local_a00;
  double local_9f8;
  double dStack_9f0;
  double local_9e8;
  double local_9e0;
  double dStack_9d8;
  double local_9d0;
  double local_9c8;
  double dStack_9c0;
  double dStack_9b8;
  double dStack_9b0;
  double local_9a8;
  double dStack_9a0;
  double dStack_998;
  double dStack_990;
  double local_988;
  double dStack_980;
  double dStack_978;
  double dStack_970;
  double local_968;
  double dStack_960;
  double dStack_958;
  double dStack_950;
  double local_948;
  double dStack_940;
  double dStack_938;
  double dStack_930;
  double local_928;
  double dStack_920;
  double dStack_918;
  double dStack_910;
  double local_908;
  double dStack_900;
  double dStack_8f8;
  double dStack_8f0;
  undefined1 local_8e8 [32];
  undefined1 local_8c8 [32];
  double local_8a8;
  double dStack_8a0;
  double local_898;
  double local_890;
  double dStack_888;
  double local_880;
  double local_878;
  double dStack_870;
  double local_868;
  double local_860;
  double dStack_858;
  double dStack_850;
  double dStack_848;
  double local_840;
  double dStack_838;
  double dStack_830;
  double dStack_828;
  double local_820;
  double dStack_818;
  double dStack_810;
  double dStack_808;
  double local_800;
  double dStack_7f8;
  double dStack_7f0;
  double dStack_7e8;
  double local_7e0;
  double dStack_7d8;
  double dStack_7d0;
  double dStack_7c8;
  double local_7c0;
  double dStack_7b8;
  double dStack_7b0;
  double dStack_7a8;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  double local_740;
  double dStack_738;
  double local_730;
  double local_728;
  double dStack_720;
  double local_718;
  double local_710;
  double dStack_708;
  double local_700;
  Matrix<double,_45,_3,_0,_45,_3> local_6f0;
  Matrix<double,_9,_3,_1,_9,_3> local_2b8;
  MatrixNx6 local_1d8;
  
  CalcCombinedCoordMatrix(this,&local_1d8);
  if ((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows
      != 9) {
    pcVar50 = 
    "Eigen::Product<Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>, Eigen::Matrix<double, 9, 6, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>, Rhs = Eigen::Matrix<double, 9, 6, 1>, Option = 0]"
    ;
LAB_00737a89:
    __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                  ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,pcVar50);
  }
  a_lhs = &this->m_SD;
  local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array[0]
       = (double)a_lhs;
  local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.array[1]
       = (double)&local_1d8;
  if ((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols
      == 0x2d) {
    memset((Matrix<double,_45,_6,_0,_45,_6> *)local_f68,0,0x870);
    local_2b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.array[0]
         = 1.0;
    Eigen::internal::
    generic_product_impl<Eigen::Transpose<Eigen::Matrix<double,-1,-1,1,-1,-1>>,Eigen::Matrix<double,9,6,1,9,6>,Eigen::DenseShape,Eigen::DenseShape,8>
    ::scaleAndAddTo<Eigen::Matrix<double,45,6,0,45,6>>
              ((Matrix<double,_45,_6,_0,_45,_6> *)local_f68,
               (Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&local_6f0,&local_1d8,
               (Scalar *)&local_2b8);
    peVar3 = (this->m_material).
             super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var4 = (this->m_material).
             super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      }
    }
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    }
    if (((this->m_kGQ_D0).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
         .m_rows == 0xc) &&
       ((this->m_kGQ_D0).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
        m_cols == 1)) {
      dVar2 = this->m_Alpha;
      pauVar5 = (undefined1 (*) [32])
                (this->m_kGQ_D0).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_data;
      local_10a8 = (double)local_f68._64_8_;
      dStack_10a0 = (double)local_f68._72_8_;
      dStack_1098 = (double)local_f68._80_8_;
      dStack_1090 = (double)local_f68._88_8_;
      local_10c8 = local_c58;
      dStack_10c0 = dStack_c50;
      dStack_10b8 = dStack_c48;
      dStack_10b0 = dStack_c40;
      auVar127._8_8_ = 0xbff0000000000000;
      auVar127._0_8_ = 0xbff0000000000000;
      auVar127._16_8_ = 0xbff0000000000000;
      auVar127._24_8_ = 0xbff0000000000000;
      dVar103 = dVar2 + dVar2;
      local_1108 = local_af0;
      dStack_1100 = dStack_ae8;
      dStack_10f8 = dStack_ae0;
      dStack_10f0 = dStack_ad8;
      local_10e8 = local_988;
      dStack_10e0 = dStack_980;
      dStack_10d8 = dStack_978;
      dStack_10d0 = dStack_970;
      local_1468 = local_de0;
      dStack_1460 = dStack_dd8;
      dStack_1458 = dStack_dd0;
      dStack_1450 = dStack_dc8;
      local_1128 = local_c78;
      dStack_1120 = dStack_c70;
      dStack_1118 = dStack_c68;
      dStack_1110 = dStack_c60;
      local_1148 = local_b10;
      dStack_1140 = dStack_b08;
      dStack_1138 = dStack_b00;
      dStack_1130 = dStack_af8;
      local_1168 = local_9a8;
      dStack_1160 = dStack_9a0;
      dStack_1158 = dStack_998;
      dStack_1150 = dStack_990;
      local_1188 = local_840;
      dStack_1180 = dStack_838;
      dStack_1178 = dStack_830;
      dStack_1170 = dStack_828;
      local_1488 = (double)local_f68._0_8_;
      dStack_1480 = (double)local_f68._8_8_;
      dStack_1478 = (double)local_f68._16_8_;
      dStack_1470 = (double)local_f68._24_8_;
      local_14c8 = local_e00;
      dStack_14c0 = dStack_df8;
      dStack_14b8 = dStack_df0;
      dStack_14b0 = dStack_de8;
      local_11a8 = local_c98;
      dStack_11a0 = dStack_c90;
      dStack_1198 = dStack_c88;
      dStack_1190 = dStack_c80;
      local_11c8 = local_b30;
      dStack_11c0 = dStack_b28;
      dStack_11b8 = dStack_b20;
      dStack_11b0 = dStack_b18;
      local_14a8 = local_9c8;
      dStack_14a0 = dStack_9c0;
      dStack_1498 = dStack_9b8;
      dStack_1490 = dStack_9b0;
      local_11e8 = local_860;
      dStack_11e0 = dStack_858;
      dStack_11d8 = dStack_850;
      dStack_11d0 = dStack_848;
      auVar106._0_8_ =
           (double)local_f68._0_8_ * (double)local_f68._0_8_ + local_e00 * local_e00 +
           local_c98 * local_c98 + -1.0 +
           dVar103 * ((double)local_f68._0_8_ * local_b30 + local_e00 * local_9c8 +
                     local_c98 * local_860);
      auVar106._8_8_ =
           (double)local_f68._8_8_ * (double)local_f68._8_8_ + dStack_df8 * dStack_df8 +
           dStack_c90 * dStack_c90 + -1.0 +
           dVar103 * ((double)local_f68._8_8_ * dStack_b28 + dStack_df8 * dStack_9c0 +
                     dStack_c90 * dStack_858);
      auVar106._16_8_ =
           (double)local_f68._16_8_ * (double)local_f68._16_8_ + dStack_df0 * dStack_df0 +
           dStack_c88 * dStack_c88 + -1.0 +
           dVar103 * ((double)local_f68._16_8_ * dStack_b20 + dStack_df0 * dStack_9b8 +
                     dStack_c88 * dStack_850);
      auVar106._24_8_ =
           (double)local_f68._24_8_ * (double)local_f68._24_8_ + dStack_de8 * dStack_de8 +
           dStack_c80 * dStack_c80 + -1.0 +
           dVar103 * ((double)local_f68._24_8_ * dStack_b18 + dStack_de8 * dStack_9b0 +
                     dStack_c80 * dStack_848);
      local_1348 = *pauVar5;
      local_1368 = *(double *)pauVar5[1];
      dStack_1360 = *(double *)(pauVar5[1] + 8);
      dStack_1358 = *(double *)(pauVar5[1] + 0x10);
      dStack_1350 = *(double *)(pauVar5[1] + 0x18);
      auVar89 = pauVar5[1];
      local_15e8 = *(double *)pauVar5[2];
      dStack_15e0 = *(double *)(pauVar5[2] + 8);
      dStack_15d8 = *(double *)(pauVar5[2] + 0x10);
      dStack_15d0 = *(double *)(pauVar5[2] + 0x18);
      auVar60 = vmulpd_avx512vl(local_1348,auVar106);
      dStack_f70 = (peVar3->m_D0).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                   m_storage.m_data.array[0] * 0.5;
      local_fc8 = auVar60._0_8_ * dStack_f70;
      dStack_fc0 = auVar60._8_8_ * dStack_f70;
      dStack_fb8 = auVar60._16_8_ * dStack_f70;
      dStack_fb0 = auVar60._24_8_ * dStack_f70;
      local_fa8 = ((double)local_f68._32_8_ * (double)local_f68._32_8_ + local_de0 * local_de0 +
                   local_c78 * local_c78 + -1.0 +
                  dVar103 * ((double)local_f68._32_8_ * local_b10 + local_de0 * local_9a8 +
                            local_c78 * local_840)) * local_1368 * dStack_f70;
      dStack_fa0 = ((double)local_f68._40_8_ * (double)local_f68._40_8_ + dStack_dd8 * dStack_dd8 +
                    dStack_c70 * dStack_c70 + -1.0 +
                   dVar103 * ((double)local_f68._40_8_ * dStack_b08 + dStack_dd8 * dStack_9a0 +
                             dStack_c70 * dStack_838)) * dStack_1360 * dStack_f70;
      dStack_f98 = ((double)local_f68._48_8_ * (double)local_f68._48_8_ + dStack_dd0 * dStack_dd0 +
                    dStack_c68 * dStack_c68 + -1.0 +
                   dVar103 * ((double)local_f68._48_8_ * dStack_b00 + dStack_dd0 * dStack_998 +
                             dStack_c68 * dStack_830)) * dStack_1358 * dStack_f70;
      dStack_f90 = ((double)local_f68._56_8_ * (double)local_f68._56_8_ + dStack_dc8 * dStack_dc8 +
                    dStack_c60 * dStack_c60 + -1.0 +
                   dVar103 * ((double)local_f68._56_8_ * dStack_af8 + dStack_dc8 * dStack_990 +
                             dStack_c60 * dStack_828)) * dStack_1350 * dStack_f70;
      local_f88 = ((double)local_f68._64_8_ * (double)local_f68._64_8_ + local_dc0 * local_dc0 +
                   local_c58 * local_c58 + -1.0 +
                  dVar103 * ((double)local_f68._64_8_ * local_af0 + local_dc0 * local_988 +
                            local_c58 * local_820)) * local_15e8 * dStack_f70;
      dStack_f80 = ((double)local_f68._72_8_ * (double)local_f68._72_8_ + dStack_db8 * dStack_db8 +
                    dStack_c50 * dStack_c50 + -1.0 +
                   dVar103 * ((double)local_f68._72_8_ * dStack_ae8 + dStack_db8 * dStack_980 +
                             dStack_c50 * dStack_818)) * dStack_15e0 * dStack_f70;
      dStack_f78 = ((double)local_f68._80_8_ * (double)local_f68._80_8_ + dStack_db0 * dStack_db0 +
                    dStack_c48 * dStack_c48 + -1.0 +
                   dVar103 * ((double)local_f68._80_8_ * dStack_ae0 + dStack_db0 * dStack_978 +
                             dStack_c48 * dStack_810)) * dStack_15d8 * dStack_f70;
      dStack_f70 = ((double)local_f68._88_8_ * (double)local_f68._88_8_ + dStack_da8 * dStack_da8 +
                    dStack_c40 * dStack_c40 + -1.0 +
                   dVar103 * ((double)local_f68._88_8_ * dStack_ad8 + dStack_da8 * dStack_970 +
                             dStack_c40 * dStack_808)) * dStack_15d0 * dStack_f70;
      local_14e8 = local_ad0;
      dStack_14e0 = dStack_ac8;
      dStack_14d8 = dStack_ac0;
      dStack_14d0 = dStack_ab8;
      local_1388 = local_968;
      dStack_1380 = dStack_960;
      dStack_1378 = dStack_958;
      dStack_1370 = dStack_950;
      local_13e8 = local_800;
      dStack_13e0 = dStack_7f8;
      dStack_13d8 = dStack_7f0;
      dStack_13d0 = dStack_7e8;
      local_1588 = local_c38;
      dStack_1580 = dStack_c30;
      dStack_1578 = dStack_c28;
      dStack_1570 = dStack_c20;
      local_1448 = local_ab0;
      dStack_1440 = dStack_aa8;
      dStack_1438 = dStack_aa0;
      dStack_1430 = dStack_a98;
      local_13a8 = local_948;
      dStack_13a0 = dStack_940;
      dStack_1398 = dStack_938;
      dStack_1390 = dStack_930;
      local_1408 = local_7e0;
      dStack_1400 = dStack_7d8;
      dStack_13f8 = dStack_7d0;
      dStack_13f0 = dStack_7c8;
      dVar90 = local_c18._0_8_;
      dVar93 = local_c18._8_8_;
      dVar95 = local_c18._16_8_;
      dVar97 = local_c18._24_8_;
      local_1568 = local_c18;
      local_13c8 = local_928;
      dStack_13c0 = dStack_920;
      dStack_13b8 = dStack_918;
      dStack_13b0 = dStack_910;
      local_1508 = local_d60;
      dStack_1500 = dStack_d58;
      dStack_14f8 = dStack_d50;
      dStack_14f0 = dStack_d48;
      local_1428 = local_7c0;
      dStack_1420 = dStack_7b8;
      dStack_1418 = dStack_7b0;
      dStack_1410 = dStack_7a8;
      auVar60 = vmulpd_avx512vl(local_f68._128_32_,local_f68._128_32_);
      auVar61 = vmulpd_avx512vl(local_c18,local_c18);
      auVar100._0_8_ =
           (double)local_f68._96_8_ * (double)local_f68._96_8_ + local_da0 * local_da0 +
           local_c38 * local_c38 + -1.0 +
           dVar103 * ((double)local_f68._96_8_ * local_ad0 + local_da0 * local_968 +
                     local_c38 * local_800);
      auVar100._8_8_ =
           (double)local_f68._104_8_ * (double)local_f68._104_8_ + dStack_d98 * dStack_d98 +
           dStack_c30 * dStack_c30 + -1.0 +
           dVar103 * ((double)local_f68._104_8_ * dStack_ac8 + dStack_d98 * dStack_960 +
                     dStack_c30 * dStack_7f8);
      auVar100._16_8_ =
           (double)local_f68._112_8_ * (double)local_f68._112_8_ + dStack_d90 * dStack_d90 +
           dStack_c28 * dStack_c28 + -1.0 +
           dVar103 * ((double)local_f68._112_8_ * dStack_ac0 + dStack_d90 * dStack_958 +
                     dStack_c28 * dStack_7f0);
      auVar100._24_8_ =
           (double)local_f68._120_8_ * (double)local_f68._120_8_ + dStack_d88 * dStack_d88 +
           dStack_c20 * dStack_c20 + -1.0 +
           dVar103 * ((double)local_f68._120_8_ * dStack_ab8 + dStack_d88 * dStack_950 +
                     dStack_c20 * dStack_7e8);
      auVar62 = vmulpd_avx512vl(local_1348,auVar100);
      auVar53._8_8_ = 0;
      auVar53._0_8_ =
           *(double *)
            ((long)(peVar3->m_D0).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                   m_storage.m_data.array + 8);
      auVar53 = vmulsd_avx512f(ZEXT816(0x3fe0000000000000),auVar53);
      dStack_fd0 = auVar53._0_8_;
      local_1048 = auVar62._0_8_ * dStack_fd0;
      dStack_1040 = auVar62._8_8_ * dStack_fd0;
      dStack_1038 = auVar62._16_8_ * dStack_fd0;
      dStack_1030 = auVar62._24_8_ * dStack_fd0;
      local_1008 = local_1368 *
                   (auVar60._0_8_ + local_d80 * local_d80 + auVar61._0_8_ + -1.0 +
                   dVar103 * (local_f68._128_8_ * local_ab0 + local_d80 * local_948 +
                             dVar90 * local_7e0)) * dStack_fd0;
      dStack_1000 = dStack_1360 *
                    (auVar60._8_8_ + dStack_d78 * dStack_d78 + auVar61._8_8_ + -1.0 +
                    dVar103 * (local_f68._136_8_ * dStack_aa8 + dStack_d78 * dStack_940 +
                              dVar93 * dStack_7d8)) * dStack_fd0;
      dStack_ff8 = dStack_1358 *
                   (auVar60._16_8_ + dStack_d70 * dStack_d70 + auVar61._16_8_ + -1.0 +
                   dVar103 * (local_f68._144_8_ * dStack_aa0 + dStack_d70 * dStack_938 +
                             dVar95 * dStack_7d0)) * dStack_fd0;
      dStack_ff0 = dStack_1350 *
                   (auVar60._24_8_ + dStack_d68 * dStack_d68 + auVar61._24_8_ + -1.0 +
                   dVar103 * (local_f68._152_8_ * dStack_a98 + dStack_d68 * dStack_930 +
                             dVar97 * dStack_7c8)) * dStack_fd0;
      local_fe8 = dStack_fd0 *
                  local_15e8 *
                  (local_ec8 * local_ec8 + local_d60 * local_d60 + local_bf8 * local_bf8 + -1.0 +
                  dVar103 * (local_ec8 * local_a90 + local_d60 * local_928 + local_bf8 * local_7c0))
      ;
      dStack_fe0 = dStack_fd0 *
                   dStack_15e0 *
                   (dStack_ec0 * dStack_ec0 + dStack_d58 * dStack_d58 + dStack_bf0 * dStack_bf0 +
                    -1.0 + dVar103 * (dStack_ec0 * dStack_a88 + dStack_d58 * dStack_920 +
                                     dStack_bf0 * dStack_7b8));
      dStack_fd8 = dStack_fd0 *
                   dStack_15d8 *
                   (dStack_eb8 * dStack_eb8 + dStack_d50 * dStack_d50 + dStack_be8 * dStack_be8 +
                    -1.0 + dVar103 * (dStack_eb8 * dStack_a80 + dStack_d50 * dStack_918 +
                                     dStack_be8 * dStack_7b0));
      dStack_fd0 = dStack_fd0 *
                   dStack_15d0 *
                   (dStack_eb0 * dStack_eb0 + dStack_d48 * dStack_d48 + dStack_be0 * dStack_be0 +
                    -1.0 + dVar103 * (dStack_eb0 * dStack_a78 + dStack_d48 * dStack_910 +
                                     dStack_be0 * dStack_7a8));
      auVar60 = vmulpd_avx512vl(local_ea8,local_a70);
      dVar119 = local_bd8._0_8_;
      dVar99 = local_bd8._8_8_;
      dVar101 = local_bd8._16_8_;
      dVar102 = local_bd8._24_8_;
      local_1328 = local_7a0;
      auVar61 = vmulpd_avx512vl(local_e88,local_a50);
      dVar114 = local_d20._0_8_;
      dVar6 = local_d20._8_8_;
      dVar109 = local_d20._16_8_;
      dVar120 = local_d20._24_8_;
      dVar91 = local_bb8._0_8_;
      dVar94 = local_bb8._8_8_;
      dVar96 = local_bb8._16_8_;
      dVar98 = local_bb8._24_8_;
      local_12e8 = local_780;
      auVar62 = vmulpd_avx512vl(local_e68,local_a30);
      auVar63 = vmulpd_avx512vl(local_d00,local_8c8);
      auVar62 = vaddpd_avx512vl(auVar62,auVar63);
      auVar63 = vmulpd_avx512vl(local_b98,local_760);
      local_1308 = local_760;
      auVar62 = vaddpd_avx512vl(auVar62,auVar63);
      auVar63 = vmulpd_avx512vl(local_ea8,local_ea8);
      auVar64 = vmulpd_avx512vl(local_d40,local_d40);
      auVar63 = vaddpd_avx512vl(auVar63,auVar64);
      auVar64 = vmulpd_avx512vl(local_bd8,local_bd8);
      auVar63 = vaddpd_avx512vl(auVar63,auVar64);
      auVar64 = vmulpd_avx512vl(local_e88,local_e88);
      auVar65 = vmulpd_avx512vl(local_d20,local_d20);
      auVar64 = vaddpd_avx512vl(auVar64,auVar65);
      auVar65 = vmulpd_avx512vl(local_bb8,local_bb8);
      auVar64 = vaddpd_avx512vl(auVar64,auVar65);
      auVar65 = vmulpd_avx512vl(local_e68,local_e68);
      auVar66 = vmulpd_avx512vl(local_d00,local_d00);
      auVar65 = vaddpd_avx512vl(auVar65,auVar66);
      auVar66 = vmulpd_avx512vl(local_b98,local_b98);
      auVar65 = vaddpd_avx512vl(auVar65,auVar66);
      auVar63 = vaddpd_avx512vl(auVar63,auVar127);
      auVar64 = vaddpd_avx512vl(auVar64,auVar127);
      auVar65 = vaddpd_avx512vl(auVar65,auVar127);
      auVar122._0_8_ =
           dVar103 * (auVar60._0_8_ + local_d40._0_8_ * local_908 + dVar119 * local_7a0._0_8_);
      auVar122._8_8_ =
           dVar103 * (auVar60._8_8_ + local_d40._8_8_ * dStack_900 + dVar99 * local_7a0._8_8_);
      auVar122._16_8_ =
           dVar103 * (auVar60._16_8_ + local_d40._16_8_ * dStack_8f8 + dVar101 * local_7a0._16_8_);
      auVar122._24_8_ =
           dVar103 * (auVar60._24_8_ + local_d40._24_8_ * dStack_8f0 + dVar102 * local_7a0._24_8_);
      auVar60 = vaddpd_avx512vl(auVar63,auVar122);
      auVar125._0_8_ =
           dVar103 * (auVar61._0_8_ + local_8e8._0_8_ * dVar114 + dVar91 * local_780._0_8_);
      auVar125._8_8_ =
           dVar103 * (auVar61._8_8_ + local_8e8._8_8_ * dVar6 + dVar94 * local_780._8_8_);
      auVar125._16_8_ =
           dVar103 * (auVar61._16_8_ + local_8e8._16_8_ * dVar109 + dVar96 * local_780._16_8_);
      auVar125._24_8_ =
           dVar103 * (auVar61._24_8_ + local_8e8._24_8_ * dVar120 + dVar98 * local_780._24_8_);
      auVar61 = vaddpd_avx512vl(auVar64,auVar125);
      auVar60 = vmulpd_avx512vl(local_1348,auVar60);
      dStack_1010 = *(double *)
                     ((long)(peVar3->m_D0).
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                            m_data.array + 0x10) * 0.5;
      local_1088 = auVar60._0_8_ * dStack_1010;
      dStack_1080 = auVar60._8_8_ * dStack_1010;
      dStack_1078 = auVar60._16_8_ * dStack_1010;
      dStack_1070 = auVar60._24_8_ * dStack_1010;
      local_1068 = local_1368 * auVar61._0_8_ * dStack_1010;
      dStack_1060 = dStack_1360 * auVar61._8_8_ * dStack_1010;
      dStack_1058 = dStack_1358 * auVar61._16_8_ * dStack_1010;
      dStack_1050 = dStack_1350 * auVar61._24_8_ * dStack_1010;
      local_1028 = dStack_1010 * local_15e8 * (auVar65._0_8_ + dVar103 * auVar62._0_8_);
      dStack_1020 = dStack_1010 * dStack_15e0 * (auVar65._8_8_ + dVar103 * auVar62._8_8_);
      dStack_1018 = dStack_1010 * dStack_15d8 * (auVar65._16_8_ + dVar103 * auVar62._16_8_);
      dStack_1010 = dStack_1010 * dStack_15d0 * (auVar65._24_8_ + dVar103 * auVar62._24_8_);
      dVar113 = local_ea8._0_8_;
      dVar115 = local_ea8._8_8_;
      dVar117 = local_ea8._16_8_;
      dVar118 = local_ea8._24_8_;
      auVar24._8_8_ = dStack_960;
      auVar24._0_8_ = local_968;
      auVar24._16_8_ = dStack_958;
      auVar24._24_8_ = dStack_950;
      auVar61 = vmulpd_avx512vl(local_d40,auVar24);
      auVar62._8_8_ = local_f68._104_8_;
      auVar62._0_8_ = local_f68._96_8_;
      auVar62._16_8_ = local_f68._112_8_;
      auVar62._24_8_ = local_f68._120_8_;
      auVar62 = vmulpd_avx512vl(auVar62,local_a70);
      auVar65._8_8_ = dStack_d98;
      auVar65._0_8_ = local_da0;
      auVar65._16_8_ = dStack_d90;
      auVar65._24_8_ = dStack_d88;
      auVar60._8_8_ = dStack_900;
      auVar60._0_8_ = local_908;
      auVar60._16_8_ = dStack_8f8;
      auVar60._24_8_ = dStack_8f0;
      auVar63 = vmulpd_avx512vl(auVar65,auVar60);
      auVar82._8_8_ = dStack_c30;
      auVar82._0_8_ = local_c38;
      auVar82._16_8_ = dStack_c28;
      auVar82._24_8_ = dStack_c20;
      auVar64 = vmulpd_avx512vl(auVar82,local_7a0);
      auVar14._8_8_ = dStack_aa8;
      auVar14._0_8_ = local_ab0;
      auVar14._16_8_ = dStack_aa0;
      auVar14._24_8_ = dStack_a98;
      auVar66 = vmulpd_avx512vl(local_e88,auVar14);
      auVar22._8_8_ = dStack_940;
      auVar22._0_8_ = local_948;
      auVar22._16_8_ = dStack_938;
      auVar22._24_8_ = dStack_930;
      auVar67 = vmulpd_avx512vl(local_d20,auVar22);
      auVar18._8_8_ = dStack_7d8;
      auVar18._0_8_ = local_7e0;
      auVar18._16_8_ = dStack_7d0;
      auVar18._24_8_ = dStack_7c8;
      auVar68 = vmulpd_avx512vl(local_bb8,auVar18);
      auVar69 = vmulpd_avx512vl(local_f68._128_32_,local_a50);
      auVar79._8_8_ = dStack_d78;
      auVar79._0_8_ = local_d80;
      auVar79._16_8_ = dStack_d70;
      auVar79._24_8_ = dStack_d68;
      auVar70 = vmulpd_avx512vl(auVar79,local_8e8);
      auVar71 = vmulpd_avx512vl(local_c18,local_780);
      auVar74._8_8_ = dStack_a88;
      auVar74._0_8_ = local_a90;
      auVar74._16_8_ = dStack_a80;
      auVar74._24_8_ = dStack_a78;
      auVar72 = vmulpd_avx512vl(local_e68,auVar74);
      auVar20._8_8_ = dStack_920;
      auVar20._0_8_ = local_928;
      auVar20._16_8_ = dStack_918;
      auVar20._24_8_ = dStack_910;
      auVar73 = vmulpd_avx512vl(local_d00,auVar20);
      auVar16._8_8_ = dStack_7b8;
      auVar16._0_8_ = local_7c0;
      auVar16._16_8_ = dStack_7b0;
      auVar16._24_8_ = dStack_7a8;
      auVar74 = vmulpd_avx512vl(local_b98,auVar16);
      auVar80._8_8_ = dStack_ec0;
      auVar80._0_8_ = local_ec8;
      auVar80._16_8_ = dStack_eb8;
      auVar80._24_8_ = dStack_eb0;
      auVar75 = vmulpd_avx512vl(auVar80,local_a30);
      auVar83._8_8_ = dStack_d58;
      auVar83._0_8_ = local_d60;
      auVar83._16_8_ = dStack_d50;
      auVar83._24_8_ = dStack_d48;
      auVar76 = vmulpd_avx512vl(auVar83,local_8c8);
      auVar81._8_8_ = dStack_bf0;
      auVar81._0_8_ = local_bf8;
      auVar81._16_8_ = dStack_be8;
      auVar81._24_8_ = dStack_be0;
      auVar65 = vmulpd_avx512vl(auVar65,local_d40);
      auVar77 = vmulpd_avx512vl(auVar82,local_bd8);
      auVar78 = vmulpd_avx512vl(local_f68._128_32_,local_e88);
      auVar79 = vmulpd_avx512vl(auVar79,local_d20);
      auVar79 = vaddpd_avx512vl(auVar78,auVar79);
      auVar78 = vmulpd_avx512vl(local_c18,local_bb8);
      auVar79 = vaddpd_avx512vl(auVar79,auVar78);
      auVar80 = vmulpd_avx512vl(auVar80,local_e68);
      auVar78 = vmulpd_avx512vl(auVar83,local_d00);
      auVar80 = vaddpd_avx512vl(auVar80,auVar78);
      auVar81 = vmulpd_avx512vl(auVar81,local_b98);
      auVar80 = vaddpd_avx512vl(auVar80,auVar81);
      auVar123._0_8_ =
           (auVar71._0_8_ +
           auVar70._0_8_ + auVar69._0_8_ + auVar68._0_8_ + auVar67._0_8_ + auVar66._0_8_) * dVar2;
      auVar123._8_8_ =
           (auVar71._8_8_ +
           auVar70._8_8_ + auVar69._8_8_ + auVar68._8_8_ + auVar67._8_8_ + auVar66._8_8_) * dVar2;
      auVar123._16_8_ =
           (auVar71._16_8_ +
           auVar70._16_8_ + auVar69._16_8_ + auVar68._16_8_ + auVar67._16_8_ + auVar66._16_8_) *
           dVar2;
      auVar123._24_8_ =
           (auVar71._24_8_ +
           auVar70._24_8_ + auVar69._24_8_ + auVar68._24_8_ + auVar67._24_8_ + auVar66._24_8_) *
           dVar2;
      auVar66 = vaddpd_avx512vl(auVar79,auVar123);
      auVar126._0_8_ =
           (local_760._0_8_ * local_bf8 +
           auVar76._0_8_ + auVar75._0_8_ + auVar74._0_8_ + auVar73._0_8_ + auVar72._0_8_) * dVar2;
      auVar126._8_8_ =
           (local_760._8_8_ * dStack_bf0 +
           auVar76._8_8_ + auVar75._8_8_ + auVar74._8_8_ + auVar73._8_8_ + auVar72._8_8_) * dVar2;
      auVar126._16_8_ =
           (local_760._16_8_ * dStack_be8 +
           auVar76._16_8_ + auVar75._16_8_ + auVar74._16_8_ + auVar73._16_8_ + auVar72._16_8_) *
           dVar2;
      auVar126._24_8_ =
           (local_760._24_8_ * dStack_be0 +
           auVar76._24_8_ + auVar75._24_8_ + auVar74._24_8_ + auVar73._24_8_ + auVar72._24_8_) *
           dVar2;
      auVar67 = vaddpd_avx512vl(auVar80,auVar126);
      dVar116 = local_1348._0_8_;
      dVar7 = local_1348._8_8_;
      dVar112 = local_1348._16_8_;
      dVar121 = local_1348._24_8_;
      dStack_11f0 = *(double *)
                     ((long)(peVar3->m_D0).
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                            m_data.array + 0x18);
      local_1248 = (auVar77._0_8_ + auVar65._0_8_ + (double)local_f68._96_8_ * dVar113 +
                   (auVar64._0_8_ +
                   auVar63._0_8_ +
                   auVar62._0_8_ + dVar119 * local_800 + auVar61._0_8_ + dVar113 * local_ad0) *
                   dVar2) * dVar116 * dStack_11f0;
      dStack_1240 = (auVar77._8_8_ + auVar65._8_8_ + (double)local_f68._104_8_ * dVar115 +
                    (auVar64._8_8_ +
                    auVar63._8_8_ +
                    auVar62._8_8_ + dVar99 * dStack_7f8 + auVar61._8_8_ + dVar115 * dStack_ac8) *
                    dVar2) * dVar7 * dStack_11f0;
      dStack_1238 = (auVar77._16_8_ + auVar65._16_8_ + (double)local_f68._112_8_ * dVar117 +
                    (auVar64._16_8_ +
                    auVar63._16_8_ +
                    auVar62._16_8_ + dVar101 * dStack_7f0 + auVar61._16_8_ + dVar117 * dStack_ac0) *
                    dVar2) * dVar112 * dStack_11f0;
      dStack_1230 = (auVar77._24_8_ + auVar65._24_8_ + (double)local_f68._120_8_ * dVar118 +
                    (auVar64._24_8_ +
                    auVar63._24_8_ +
                    auVar62._24_8_ + dVar102 * dStack_7e8 + auVar61._24_8_ + dVar118 * dStack_ab8) *
                    dVar2) * dVar121 * dStack_11f0;
      local_1228 = auVar66._0_8_ * local_1368 * dStack_11f0;
      dStack_1220 = auVar66._8_8_ * dStack_1360 * dStack_11f0;
      dStack_1218 = auVar66._16_8_ * dStack_1358 * dStack_11f0;
      dStack_1210 = auVar66._24_8_ * dStack_1350 * dStack_11f0;
      local_1208 = dStack_11f0 * auVar67._0_8_ * local_15e8;
      dStack_1200 = dStack_11f0 * auVar67._8_8_ * dStack_15e0;
      dStack_11f8 = dStack_11f0 * auVar67._16_8_ * dStack_15d8;
      dStack_11f0 = dStack_11f0 * auVar67._24_8_ * dStack_15d0;
      auVar29._8_8_ = dStack_b28;
      auVar29._0_8_ = local_b30;
      auVar29._16_8_ = dStack_b20;
      auVar29._24_8_ = dStack_b18;
      auVar61 = vmulpd_avx512vl(auVar29,local_ea8);
      local_15c8 = local_ea8;
      auVar86._8_8_ = dStack_9c0;
      auVar86._0_8_ = local_9c8;
      auVar86._16_8_ = dStack_9b8;
      auVar86._24_8_ = dStack_9b0;
      auVar62 = vmulpd_avx512vl(local_d40,auVar86);
      auVar61 = vaddpd_avx512vl(auVar61,auVar62);
      auVar28._8_8_ = dStack_858;
      auVar28._0_8_ = local_860;
      auVar28._16_8_ = dStack_850;
      auVar28._24_8_ = dStack_848;
      auVar62 = vmulpd_avx512vl(auVar28,local_bd8);
      local_12a8 = local_bd8;
      auVar61 = vaddpd_avx512vl(auVar61,auVar62);
      auVar11._8_8_ = local_f68._8_8_;
      auVar11._0_8_ = local_f68._0_8_;
      auVar11._16_8_ = local_f68._16_8_;
      auVar11._24_8_ = local_f68._24_8_;
      auVar84._8_8_ = dStack_df8;
      auVar84._0_8_ = local_e00;
      auVar84._16_8_ = dStack_df0;
      auVar84._24_8_ = dStack_de8;
      auVar62 = vmulpd_avx512vl(auVar84,auVar60);
      auVar30._8_8_ = dStack_c90;
      auVar30._0_8_ = local_c98;
      auVar30._16_8_ = dStack_c88;
      auVar30._24_8_ = dStack_c80;
      auVar33._8_8_ = dStack_b08;
      auVar33._0_8_ = local_b10;
      auVar33._16_8_ = dStack_b00;
      auVar33._24_8_ = dStack_af8;
      auVar63 = vmulpd_avx512vl(auVar33,local_e88);
      _local_15a8 = local_e88;
      auVar60 = _local_15a8;
      auVar32._8_8_ = dStack_9a0;
      auVar32._0_8_ = local_9a8;
      auVar32._16_8_ = dStack_998;
      auVar32._24_8_ = dStack_990;
      local_1528 = local_d20;
      auVar64 = vmulpd_avx512vl(auVar32,local_d20);
      auVar31._8_8_ = dStack_838;
      auVar31._0_8_ = local_840;
      auVar31._16_8_ = dStack_830;
      auVar31._24_8_ = dStack_828;
      auVar65 = vmulpd_avx512vl(auVar31,local_bb8);
      local_1288 = local_bb8;
      auVar73._8_8_ = local_f68._40_8_;
      auVar73._0_8_ = local_f68._32_8_;
      auVar73._16_8_ = local_f68._48_8_;
      auVar73._24_8_ = local_f68._56_8_;
      auVar66 = vmulpd_avx512vl(auVar73,local_a50);
      auVar12._8_8_ = dStack_dd8;
      auVar12._0_8_ = local_de0;
      auVar12._16_8_ = dStack_dd0;
      auVar12._24_8_ = dStack_dc8;
      auVar34._8_8_ = dStack_c70;
      auVar34._0_8_ = local_c78;
      auVar34._16_8_ = dStack_c68;
      auVar34._24_8_ = dStack_c60;
      auVar35._8_8_ = dStack_ae8;
      auVar35._0_8_ = local_af0;
      auVar35._16_8_ = dStack_ae0;
      auVar35._24_8_ = dStack_ad8;
      local_12c8 = local_e68;
      auVar67 = vmulpd_avx512vl(auVar35,local_e68);
      auVar36._8_8_ = dStack_980;
      auVar36._0_8_ = local_988;
      auVar36._16_8_ = dStack_978;
      auVar36._24_8_ = dStack_970;
      auVar79 = vmulpd_avx512vl(auVar36,local_d00);
      local_1268 = local_b98;
      auVar76._8_8_ = dStack_818;
      auVar76._0_8_ = local_820;
      auVar76._16_8_ = dStack_810;
      auVar76._24_8_ = dStack_808;
      auVar68 = vmulpd_avx512vl(local_b98,auVar76);
      auVar38._8_8_ = local_f68._72_8_;
      auVar38._0_8_ = local_f68._64_8_;
      auVar38._16_8_ = local_f68._80_8_;
      auVar38._24_8_ = local_f68._88_8_;
      auVar80 = vmulpd_avx512vl(auVar38,local_a30);
      auVar78._8_8_ = dStack_db8;
      auVar78._0_8_ = local_dc0;
      auVar78._16_8_ = dStack_db0;
      auVar78._24_8_ = dStack_da8;
      auVar69 = vmulpd_avx512vl(auVar78,local_8c8);
      auVar37._8_8_ = dStack_c50;
      auVar37._0_8_ = local_c58;
      auVar37._16_8_ = dStack_c48;
      auVar37._24_8_ = dStack_c40;
      auVar70 = vmulpd_avx512vl(auVar37,local_760);
      auVar81 = vmulpd_avx512vl(auVar11,local_ea8);
      local_1548 = local_d40;
      auVar71 = vmulpd_avx512vl(auVar84,local_d40);
      auVar72 = vmulpd_avx512vl(auVar73,local_e88);
      auVar74 = vmulpd_avx512vl(auVar12,local_d20);
      auVar75 = vmulpd_avx512vl(auVar38,local_e68);
      auVar76 = vmulpd_avx512vl(auVar78,local_d00);
      auVar77 = vmulpd_avx512vl(auVar37,local_b98);
      auVar104._0_8_ =
           auVar72._0_8_ + auVar74._0_8_ + local_c78 * dVar91 +
           dVar2 * (local_c78 * local_780._0_8_ +
                   local_de0 * local_8e8._0_8_ +
                   auVar66._0_8_ + auVar65._0_8_ + auVar64._0_8_ + auVar63._0_8_);
      auVar104._8_8_ =
           auVar72._8_8_ + auVar74._8_8_ + dStack_c70 * dVar94 +
           dVar2 * (dStack_c70 * local_780._8_8_ +
                   dStack_dd8 * local_8e8._8_8_ +
                   auVar66._8_8_ + auVar65._8_8_ + auVar64._8_8_ + auVar63._8_8_);
      auVar104._16_8_ =
           auVar72._16_8_ + auVar74._16_8_ + dStack_c68 * dVar96 +
           dVar2 * (dStack_c68 * local_780._16_8_ +
                   dStack_dd0 * local_8e8._16_8_ +
                   auVar66._16_8_ + auVar65._16_8_ + auVar64._16_8_ + auVar63._16_8_);
      auVar104._24_8_ =
           auVar72._24_8_ + auVar74._24_8_ + dStack_c60 * dVar98 +
           dVar2 * (dStack_c60 * local_780._24_8_ +
                   dStack_dc8 * local_8e8._24_8_ +
                   auVar66._24_8_ + auVar65._24_8_ + auVar64._24_8_ + auVar63._24_8_);
      auVar63 = vmulpd_avx512vl(auVar89,auVar104);
      dVar103 = *(double *)
                 ((long)(peVar3->m_D0).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                        m_storage.m_data.array + 0x20);
      auVar107._0_8_ =
           dVar116 * (auVar81._0_8_ + auVar71._0_8_ + local_c98 * dVar119 +
                     dVar2 * (local_c98 * local_7a0._0_8_ +
                             local_a70._0_8_ * (double)local_f68._0_8_ + auVar61._0_8_ +
                             auVar62._0_8_)) * dVar103;
      auVar107._8_8_ =
           dVar7 * (auVar81._8_8_ + auVar71._8_8_ + dStack_c90 * dVar99 +
                   dVar2 * (dStack_c90 * local_7a0._8_8_ +
                           local_a70._8_8_ * (double)local_f68._8_8_ + auVar61._8_8_ + auVar62._8_8_
                           )) * dVar103;
      auVar107._16_8_ =
           dVar112 * (auVar81._16_8_ + auVar71._16_8_ + dStack_c88 * dVar101 +
                     dVar2 * (dStack_c88 * local_7a0._16_8_ +
                             local_a70._16_8_ * (double)local_f68._16_8_ + auVar61._16_8_ +
                             auVar62._16_8_)) * dVar103;
      auVar107._24_8_ =
           dVar121 * (auVar81._24_8_ + auVar71._24_8_ + dStack_c80 * dVar102 +
                     dVar2 * (dStack_c80 * local_7a0._24_8_ +
                             local_a70._24_8_ * (double)local_f68._24_8_ + auVar61._24_8_ +
                             auVar62._24_8_)) * dVar103;
      local_1698._0_8_ = auVar63._0_8_ * dVar103;
      local_1698._8_8_ = auVar63._8_8_ * dVar103;
      dStack_1688 = auVar63._16_8_ * dVar103;
      dStack_1680 = auVar63._24_8_ * dVar103;
      dVar99 = dVar103 * local_15e8 *
                         (auVar77._0_8_ + auVar76._0_8_ + auVar75._0_8_ +
                         dVar2 * (auVar70._0_8_ +
                                 auVar69._0_8_ +
                                 auVar80._0_8_ + auVar67._0_8_ + auVar79._0_8_ + auVar68._0_8_));
      dVar101 = dVar103 * dStack_15e0 *
                          (auVar77._8_8_ + auVar76._8_8_ + auVar75._8_8_ +
                          dVar2 * (auVar70._8_8_ +
                                  auVar69._8_8_ +
                                  auVar80._8_8_ + auVar67._8_8_ + auVar79._8_8_ + auVar68._8_8_));
      dVar102 = dVar103 * dStack_15d8 *
                          (auVar77._16_8_ + auVar76._16_8_ + auVar75._16_8_ +
                          dVar2 * (auVar70._16_8_ +
                                  auVar69._16_8_ +
                                  auVar80._16_8_ + auVar67._16_8_ + auVar79._16_8_ + auVar68._16_8_)
                          );
      dVar103 = dVar103 * dStack_15d0 *
                          (auVar77._24_8_ + auVar76._24_8_ + auVar75._24_8_ +
                          dVar2 * (auVar70._24_8_ +
                                  auVar69._24_8_ +
                                  auVar80._24_8_ + auVar67._24_8_ + auVar79._24_8_ + auVar68._24_8_)
                          );
      auVar63._8_8_ = local_f68._104_8_;
      auVar63._0_8_ = local_f68._96_8_;
      auVar63._16_8_ = local_f68._112_8_;
      auVar63._24_8_ = local_f68._120_8_;
      auVar61 = vmulpd_avx512vl(auVar29,auVar63);
      auVar66._8_8_ = dStack_d98;
      auVar66._0_8_ = local_da0;
      auVar66._16_8_ = dStack_d90;
      auVar66._24_8_ = dStack_d88;
      auVar87._8_8_ = dStack_9c0;
      auVar87._0_8_ = local_9c8;
      auVar87._16_8_ = dStack_9b8;
      auVar87._24_8_ = dStack_9b0;
      auVar62 = vmulpd_avx512vl(auVar66,auVar87);
      auVar9._8_8_ = dStack_c30;
      auVar9._0_8_ = local_c38;
      auVar9._16_8_ = dStack_c28;
      auVar9._24_8_ = dStack_c20;
      auVar64 = vmulpd_avx512vl(auVar28,auVar9);
      auVar19._8_8_ = dStack_7f8;
      auVar19._0_8_ = local_800;
      auVar19._16_8_ = dStack_7f0;
      auVar19._24_8_ = dStack_7e8;
      auVar65 = vmulpd_avx512vl(auVar30,auVar19);
      auVar67 = vmulpd_avx512vl(auVar33,local_f68._128_32_);
      auVar68._8_8_ = dStack_d78;
      auVar68._0_8_ = local_d80;
      auVar68._16_8_ = dStack_d70;
      auVar68._24_8_ = dStack_d68;
      auVar79 = vmulpd_avx512vl(auVar32,auVar68);
      auVar80 = vmulpd_avx512vl(auVar31,local_c18);
      auVar15._8_8_ = dStack_aa8;
      auVar15._0_8_ = local_ab0;
      auVar15._16_8_ = dStack_aa0;
      auVar15._24_8_ = dStack_a98;
      auVar70 = vmulpd_avx512vl(auVar73,auVar15);
      auVar23._8_8_ = dStack_940;
      auVar23._0_8_ = local_948;
      auVar23._16_8_ = dStack_938;
      auVar23._24_8_ = dStack_930;
      auVar81 = vmulpd_avx512vl(auVar12,auVar23);
      auVar69._8_8_ = dStack_ec0;
      auVar69._0_8_ = local_ec8;
      auVar69._16_8_ = dStack_eb8;
      auVar69._24_8_ = dStack_eb0;
      auVar10._8_8_ = dStack_d58;
      auVar10._0_8_ = local_d60;
      auVar10._16_8_ = dStack_d50;
      auVar10._24_8_ = dStack_d48;
      auVar72 = vmulpd_avx512vl(auVar36,auVar10);
      auVar71._8_8_ = dStack_bf0;
      auVar71._0_8_ = local_bf8;
      auVar71._16_8_ = dStack_be8;
      auVar71._24_8_ = dStack_be0;
      auVar77._8_8_ = dStack_818;
      auVar77._0_8_ = local_820;
      auVar77._16_8_ = dStack_810;
      auVar77._24_8_ = dStack_808;
      auVar74 = vmulpd_avx512vl(auVar71,auVar77);
      auVar75._8_8_ = dStack_a88;
      auVar75._0_8_ = local_a90;
      auVar75._16_8_ = dStack_a80;
      auVar75._24_8_ = dStack_a78;
      auVar75 = vmulpd_avx512vl(auVar38,auVar75);
      auVar21._8_8_ = dStack_920;
      auVar21._0_8_ = local_928;
      auVar21._16_8_ = dStack_918;
      auVar21._24_8_ = dStack_910;
      auVar76 = vmulpd_avx512vl(auVar78,auVar21);
      auVar17._8_8_ = dStack_7b8;
      auVar17._0_8_ = local_7c0;
      auVar17._16_8_ = dStack_7b0;
      auVar17._24_8_ = dStack_7a8;
      auVar77 = vmulpd_avx512vl(auVar37,auVar17);
      auVar82 = vmulpd_avx512vl(auVar11,auVar63);
      auVar83 = vmulpd_avx512vl(auVar84,auVar66);
      auVar84 = vmulpd_avx512vl(auVar30,auVar9);
      auVar85 = vmulpd_avx512vl(auVar73,local_f68._128_32_);
      auVar68 = vmulpd_avx512vl(auVar12,auVar68);
      auVar86 = vmulpd_avx512vl(auVar34,local_c18);
      auVar87 = vmulpd_avx512vl(auVar38,auVar69);
      auVar88 = vmulpd_avx512vl(auVar78,auVar10);
      auVar71 = vmulpd_avx512vl(auVar37,auVar71);
      auVar110._0_8_ =
           auVar85._0_8_ + auVar68._0_8_ + auVar86._0_8_ +
           dVar2 * (local_c78 * local_7e0 +
                   auVar81._0_8_ + auVar70._0_8_ + auVar67._0_8_ + auVar79._0_8_ + auVar80._0_8_);
      auVar110._8_8_ =
           auVar85._8_8_ + auVar68._8_8_ + auVar86._8_8_ +
           dVar2 * (dStack_c70 * dStack_7d8 +
                   auVar81._8_8_ + auVar70._8_8_ + auVar67._8_8_ + auVar79._8_8_ + auVar80._8_8_);
      auVar110._16_8_ =
           auVar85._16_8_ + auVar68._16_8_ + auVar86._16_8_ +
           dVar2 * (dStack_c68 * dStack_7d0 +
                   auVar81._16_8_ +
                   auVar70._16_8_ + auVar67._16_8_ + auVar79._16_8_ + auVar80._16_8_);
      auVar110._24_8_ =
           auVar85._24_8_ + auVar68._24_8_ + auVar86._24_8_ +
           dVar2 * (dStack_c60 * dStack_7c8 +
                   auVar81._24_8_ +
                   auVar70._24_8_ + auVar67._24_8_ + auVar79._24_8_ + auVar80._24_8_);
      dVar119 = *(double *)
                 ((long)(peVar3->m_D0).super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                        m_storage.m_data.array + 0x28);
      auVar89 = vmulpd_avx512vl(auVar89,auVar110);
      auVar111._0_8_ =
           dVar116 * (auVar82._0_8_ + auVar83._0_8_ + auVar84._0_8_ +
                     dVar2 * (auVar65._0_8_ +
                             local_e00 * local_968 +
                             (double)local_f68._0_8_ * local_ad0 +
                             auVar61._0_8_ + auVar62._0_8_ + auVar64._0_8_)) * dVar119;
      auVar111._8_8_ =
           dVar7 * (auVar82._8_8_ + auVar83._8_8_ + auVar84._8_8_ +
                   dVar2 * (auVar65._8_8_ +
                           dStack_df8 * dStack_960 +
                           (double)local_f68._8_8_ * dStack_ac8 +
                           auVar61._8_8_ + auVar62._8_8_ + auVar64._8_8_)) * dVar119;
      auVar111._16_8_ =
           dVar112 * (auVar82._16_8_ + auVar83._16_8_ + auVar84._16_8_ +
                     dVar2 * (auVar65._16_8_ +
                             dStack_df0 * dStack_958 +
                             (double)local_f68._16_8_ * dStack_ac0 +
                             auVar61._16_8_ + auVar62._16_8_ + auVar64._16_8_)) * dVar119;
      auVar111._24_8_ =
           dVar121 * (auVar82._24_8_ + auVar83._24_8_ + auVar84._24_8_ +
                     dVar2 * (auVar65._24_8_ +
                             dStack_de8 * dStack_950 +
                             (double)local_f68._24_8_ * dStack_ab8 +
                             auVar61._24_8_ + auVar62._24_8_ + auVar64._24_8_)) * dVar119;
      auVar108._0_8_ = auVar89._0_8_ * dVar119;
      auVar108._8_8_ = auVar89._8_8_ * dVar119;
      auVar108._16_8_ = auVar89._16_8_ * dVar119;
      auVar108._24_8_ = auVar89._24_8_ * dVar119;
      auVar92._0_8_ =
           local_15e8 *
           (auVar87._0_8_ + auVar88._0_8_ + auVar71._0_8_ +
           dVar2 * (auVar77._0_8_ +
                   auVar76._0_8_ +
                   auVar75._0_8_ + auVar74._0_8_ + auVar72._0_8_ + local_af0 * local_ec8)) * dVar119
      ;
      auVar92._8_8_ =
           dStack_15e0 *
           (auVar87._8_8_ + auVar88._8_8_ + auVar71._8_8_ +
           dVar2 * (auVar77._8_8_ +
                   auVar76._8_8_ +
                   auVar75._8_8_ + auVar74._8_8_ + auVar72._8_8_ + dStack_ae8 * dStack_ec0)) *
           dVar119;
      auVar92._16_8_ =
           dStack_15d8 *
           (auVar87._16_8_ + auVar88._16_8_ + auVar71._16_8_ +
           dVar2 * (auVar77._16_8_ +
                   auVar76._16_8_ +
                   auVar75._16_8_ + auVar74._16_8_ + auVar72._16_8_ + dStack_ae0 * dStack_eb8)) *
           dVar119;
      auVar92._24_8_ =
           dStack_15d0 *
           (auVar87._24_8_ + auVar88._24_8_ + auVar71._24_8_ +
           dVar2 * (auVar77._24_8_ +
                   auVar76._24_8_ +
                   auVar75._24_8_ + auVar74._24_8_ + auVar72._24_8_ + dStack_ad8 * dStack_eb0)) *
           dVar119;
      auVar44._8_8_ = dStack_fc0;
      auVar44._0_8_ = local_fc8;
      auVar44._16_8_ = dStack_fb8;
      auVar44._24_8_ = dStack_fb0;
      auVar89 = vmulpd_avx512vl(auVar11,auVar44);
      auVar61 = vmulpd_avx512vl(auVar63,auVar111);
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0] = dVar113 * auVar107._0_8_ + auVar61._0_8_ + auVar89._0_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[1] = dVar115 * auVar107._8_8_ + auVar61._8_8_ + auVar89._8_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[2] = dVar117 * auVar107._16_8_ + auVar61._16_8_ + auVar89._16_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[3] = dVar118 * auVar107._24_8_ + auVar61._24_8_ + auVar89._24_8_;
      auVar45._8_8_ = dStack_fa0;
      auVar45._0_8_ = local_fa8;
      auVar45._16_8_ = dStack_f98;
      auVar45._24_8_ = dStack_f90;
      auVar89 = vmulpd_avx512vl(auVar73,auVar45);
      auVar61 = vmulpd_avx512vl(local_f68._128_32_,auVar108);
      local_15a8._0_8_ = local_e88._0_8_;
      local_15a8._8_8_ = local_e88._8_8_;
      dStack_1598 = local_e88._16_8_;
      dStack_1590 = local_e88._24_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[4] = (double)local_15a8._0_8_ * (double)local_1698._0_8_ + auVar61._0_8_ + auVar89._0_8_
      ;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[5] = (double)local_15a8._8_8_ * (double)local_1698._8_8_ + auVar61._8_8_ + auVar89._8_8_
      ;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[6] = dStack_1598 * dStack_1688 + auVar61._16_8_ + auVar89._16_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[7] = dStack_1590 * dStack_1680 + auVar61._24_8_ + auVar89._24_8_;
      auVar46._8_8_ = dStack_f80;
      auVar46._0_8_ = local_f88;
      auVar46._16_8_ = dStack_f78;
      auVar46._24_8_ = dStack_f70;
      auVar61 = vmulpd_avx512vl(auVar38,auVar46);
      auVar89._8_8_ = dVar101;
      auVar89._0_8_ = dVar99;
      auVar89._16_8_ = dVar102;
      auVar89._24_8_ = dVar103;
      auVar62 = vmulpd_avx512vl(local_e68,auVar89);
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[8] = auVar62._0_8_ + local_ec8 * auVar92._0_8_ + auVar61._0_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[9] = auVar62._8_8_ + dStack_ec0 * auVar92._8_8_ + auVar61._8_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[10] = auVar62._16_8_ + dStack_eb8 * auVar92._16_8_ + auVar61._16_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0xb] = auVar62._24_8_ + dStack_eb0 * auVar92._24_8_ + auVar61._24_8_;
      auVar85._8_8_ = dStack_df8;
      auVar85._0_8_ = local_e00;
      auVar85._16_8_ = dStack_df0;
      auVar85._24_8_ = dStack_de8;
      auVar61 = vmulpd_avx512vl(auVar85,auVar44);
      auVar62 = vmulpd_avx512vl(auVar66,auVar111);
      auVar64 = vmulpd_avx512vl(auVar107,local_d40);
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x2d] = auVar64._0_8_ + auVar62._0_8_ + auVar61._0_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x2e] = auVar64._8_8_ + auVar62._8_8_ + auVar61._8_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x2f] = auVar64._16_8_ + auVar62._16_8_ + auVar61._16_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x30] = auVar64._24_8_ + auVar62._24_8_ + auVar61._24_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x31] = (double)local_1698._0_8_ * dVar114 +
                    local_d80 * auVar108._0_8_ + local_fa8 * local_de0;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x32] = (double)local_1698._8_8_ * dVar6 +
                    dStack_d78 * auVar108._8_8_ + dStack_fa0 * dStack_dd8;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x33] = dStack_1688 * dVar109 + dStack_d70 * auVar108._16_8_ + dStack_f98 * dStack_dd0;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x34] = dStack_1680 * dVar120 + dStack_d68 * auVar108._24_8_ + dStack_f90 * dStack_dc8;
      auVar61 = vmulpd_avx512vl(auVar78,auVar46);
      auVar62 = vmulpd_avx512vl(auVar10,auVar92);
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x35] = local_d00._0_8_ * dVar99 + auVar62._0_8_ + auVar61._0_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x36] = local_d00._8_8_ * dVar101 + auVar62._8_8_ + auVar61._8_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x37] = local_d00._16_8_ * dVar102 + auVar62._16_8_ + auVar61._16_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x38] = local_d00._24_8_ * dVar103 + auVar62._24_8_ + auVar61._24_8_;
      auVar61 = vmulpd_avx512vl(auVar30,auVar44);
      auVar62 = vmulpd_avx512vl(auVar9,auVar111);
      auVar64 = vmulpd_avx512vl(local_bd8,auVar107);
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x5a] = auVar64._0_8_ + auVar62._0_8_ + auVar61._0_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x5b] = auVar64._8_8_ + auVar62._8_8_ + auVar61._8_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x5c] = auVar64._16_8_ + auVar62._16_8_ + auVar61._16_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x5d] = auVar64._24_8_ + auVar62._24_8_ + auVar61._24_8_;
      auVar61 = vmulpd_avx512vl(auVar34,auVar45);
      auVar62 = vmulpd_avx512vl(local_c18,auVar108);
      auVar64 = vmulpd_avx512vl(local_bb8,_local_1698);
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x5e] = auVar64._0_8_ + auVar62._0_8_ + auVar61._0_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x5f] = auVar64._8_8_ + auVar62._8_8_ + auVar61._8_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x60] = auVar64._16_8_ + auVar62._16_8_ + auVar61._16_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x61] = auVar64._24_8_ + auVar62._24_8_ + auVar61._24_8_;
      auVar61 = vmulpd_avx512vl(auVar37,auVar46);
      auVar72._8_8_ = dStack_bf0;
      auVar72._0_8_ = local_bf8;
      auVar72._16_8_ = dStack_be8;
      auVar72._24_8_ = dStack_be0;
      auVar62 = vmulpd_avx512vl(auVar72,auVar92);
      auVar89 = vmulpd_avx512vl(local_b98,auVar89);
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x62] = auVar89._0_8_ + auVar62._0_8_ + auVar61._0_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[99] = auVar89._8_8_ + auVar62._8_8_ + auVar61._8_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[100] = auVar89._16_8_ + auVar62._16_8_ + auVar61._16_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x65] = auVar89._24_8_ + auVar62._24_8_ + auVar61._24_8_;
      auVar88._8_8_ = local_f68._8_8_;
      auVar88._0_8_ = local_f68._0_8_;
      auVar88._16_8_ = local_f68._16_8_;
      auVar88._24_8_ = local_f68._24_8_;
      auVar89 = vmulpd_avx512vl(auVar88,auVar111);
      auVar40._8_8_ = dStack_1040;
      auVar40._0_8_ = local_1048;
      auVar40._16_8_ = dStack_1038;
      auVar40._24_8_ = dStack_1030;
      auVar61 = vmulpd_avx512vl(auVar63,auVar40);
      auVar25._8_8_ = dStack_1240;
      auVar25._0_8_ = local_1248;
      auVar25._16_8_ = dStack_1238;
      auVar25._24_8_ = dStack_1230;
      auVar62 = vmulpd_avx512vl(local_ea8,auVar25);
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0xc] = auVar62._0_8_ + auVar61._0_8_ + auVar89._0_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0xd] = auVar62._8_8_ + auVar61._8_8_ + auVar89._8_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0xe] = auVar62._16_8_ + auVar61._16_8_ + auVar89._16_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0xf] = auVar62._24_8_ + auVar61._24_8_ + auVar89._24_8_;
      auVar42._8_8_ = dStack_1000;
      auVar42._0_8_ = local_1008;
      auVar42._16_8_ = dStack_ff8;
      auVar42._24_8_ = dStack_ff0;
      auVar89 = vmulpd_avx512vl(local_f68._128_32_,auVar42);
      auVar26._8_8_ = dStack_1220;
      auVar26._0_8_ = local_1228;
      auVar26._16_8_ = dStack_1218;
      auVar26._24_8_ = dStack_1210;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x10] = (double)local_15a8._0_8_ * local_1228 +
                    auVar89._0_8_ + auVar108._0_8_ * (double)local_f68._32_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x11] = (double)local_15a8._8_8_ * dStack_1220 +
                    auVar89._8_8_ + auVar108._8_8_ * (double)local_f68._40_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x12] = dStack_1598 * dStack_1218 +
                    auVar89._16_8_ + auVar108._16_8_ * (double)local_f68._48_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x13] = dStack_1590 * dStack_1210 +
                    auVar89._24_8_ + auVar108._24_8_ * (double)local_f68._56_8_;
      auVar89 = vmulpd_avx512vl(auVar38,auVar92);
      auVar43._8_8_ = dStack_fe0;
      auVar43._0_8_ = local_fe8;
      auVar43._16_8_ = dStack_fd8;
      auVar43._24_8_ = dStack_fd0;
      auVar61 = vmulpd_avx512vl(auVar69,auVar43);
      auVar27._8_8_ = dStack_1200;
      auVar27._0_8_ = local_1208;
      auVar27._16_8_ = dStack_11f8;
      auVar27._24_8_ = dStack_11f0;
      auVar62 = vmulpd_avx512vl(local_e68,auVar27);
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x14] = auVar62._0_8_ + auVar61._0_8_ + auVar89._0_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x15] = auVar62._8_8_ + auVar61._8_8_ + auVar89._8_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x16] = auVar62._16_8_ + auVar61._16_8_ + auVar89._16_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x17] = auVar62._24_8_ + auVar61._24_8_ + auVar89._24_8_;
      auVar89 = vmulpd_avx512vl(auVar85,auVar111);
      auVar61 = vmulpd_avx512vl(auVar66,auVar40);
      auVar62 = vmulpd_avx512vl(local_d40,auVar25);
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x39] = auVar62._0_8_ + auVar61._0_8_ + auVar89._0_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x3a] = auVar62._8_8_ + auVar61._8_8_ + auVar89._8_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x3b] = auVar62._16_8_ + auVar61._16_8_ + auVar89._16_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x3c] = auVar62._24_8_ + auVar61._24_8_ + auVar89._24_8_;
      auVar13._8_8_ = dStack_dd8;
      auVar13._0_8_ = local_de0;
      auVar13._16_8_ = dStack_dd0;
      auVar13._24_8_ = dStack_dc8;
      auVar89 = vmulpd_avx512vl(auVar13,auVar108);
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x3d] = dVar114 * local_1228 + local_d80 * local_1008 + auVar89._0_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x3e] = dVar6 * dStack_1220 + dStack_d78 * dStack_1000 + auVar89._8_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x3f] = dVar109 * dStack_1218 + dStack_d70 * dStack_ff8 + auVar89._16_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x40] = dVar120 * dStack_1210 + dStack_d68 * dStack_ff0 + auVar89._24_8_;
      auVar89 = vmulpd_avx512vl(auVar10,auVar43);
      auVar61 = vmulpd_avx512vl(local_d00,auVar27);
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x41] = auVar61._0_8_ + auVar89._0_8_ + local_dc0 * auVar92._0_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x42] = auVar61._8_8_ + auVar89._8_8_ + dStack_db8 * auVar92._8_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x43] = auVar61._16_8_ + auVar89._16_8_ + dStack_db0 * auVar92._16_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x44] = auVar61._24_8_ + auVar89._24_8_ + dStack_da8 * auVar92._24_8_;
      auVar89 = vmulpd_avx512vl(auVar9,auVar40);
      auVar61 = vmulpd_avx512vl(local_bd8,auVar25);
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x66] = auVar61._0_8_ + auVar89._0_8_ + local_c98 * auVar111._0_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x67] = auVar61._8_8_ + auVar89._8_8_ + dStack_c90 * auVar111._8_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x68] = auVar61._16_8_ + auVar89._16_8_ + dStack_c88 * auVar111._16_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x69] = auVar61._24_8_ + auVar89._24_8_ + dStack_c80 * auVar111._24_8_;
      auVar89 = vmulpd_avx512vl(auVar34,auVar108);
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x6a] = dVar91 * local_1228 + dVar90 * local_1008 + auVar89._0_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x6b] = dVar94 * dStack_1220 + dVar93 * dStack_1000 + auVar89._8_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x6c] = dVar96 * dStack_1218 + dVar95 * dStack_ff8 + auVar89._16_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x6d] = dVar98 * dStack_1210 + dVar97 * dStack_ff0 + auVar89._24_8_;
      auVar89 = vmulpd_avx512vl(auVar37,auVar92);
      auVar61 = vmulpd_avx512vl(auVar72,auVar43);
      auVar62 = vmulpd_avx512vl(local_b98,auVar27);
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x6e] = auVar61._0_8_ + auVar89._0_8_ + auVar62._0_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x6f] = auVar61._8_8_ + auVar89._8_8_ + auVar62._8_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x70] = auVar61._16_8_ + auVar89._16_8_ + auVar62._16_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x71] = auVar61._24_8_ + auVar89._24_8_ + auVar62._24_8_;
      auVar89 = vmulpd_avx512vl(auVar88,auVar107);
      auVar64._8_8_ = local_f68._104_8_;
      auVar64._0_8_ = local_f68._96_8_;
      auVar64._16_8_ = local_f68._112_8_;
      auVar64._24_8_ = local_f68._120_8_;
      auVar61 = vmulpd_avx512vl(auVar25,auVar64);
      auVar39._8_8_ = dStack_1080;
      auVar39._0_8_ = local_1088;
      auVar39._16_8_ = dStack_1078;
      auVar39._24_8_ = dStack_1070;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x18] = local_1088 * dVar113 + auVar61._0_8_ + auVar89._0_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x19] = dStack_1080 * dVar115 + auVar61._8_8_ + auVar89._8_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x1a] = dStack_1078 * dVar117 + auVar61._16_8_ + auVar89._16_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x1b] = dStack_1070 * dVar118 + auVar61._24_8_ + auVar89._24_8_;
      auVar89 = vmulpd_avx512vl(local_f68._128_32_,auVar26);
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x1c] = local_1068 * (double)local_15a8._0_8_ +
                    auVar89._0_8_ + (double)local_1698._0_8_ * (double)local_f68._32_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x1d] = dStack_1060 * (double)local_15a8._8_8_ +
                    auVar89._8_8_ + (double)local_1698._8_8_ * (double)local_f68._40_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x1e] = dStack_1058 * dStack_1598 +
                    auVar89._16_8_ + dStack_1688 * (double)local_f68._48_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x1f] = dStack_1050 * dStack_1590 +
                    auVar89._24_8_ + dStack_1680 * (double)local_f68._56_8_;
      auVar61._8_8_ = dVar101;
      auVar61._0_8_ = dVar99;
      auVar61._16_8_ = dVar102;
      auVar61._24_8_ = dVar103;
      auVar89 = vmulpd_avx512vl(auVar38,auVar61);
      auVar70._8_8_ = dStack_ec0;
      auVar70._0_8_ = local_ec8;
      auVar70._16_8_ = dStack_eb8;
      auVar70._24_8_ = dStack_eb0;
      auVar62 = vmulpd_avx512vl(auVar27,auVar70);
      auVar41._8_8_ = dStack_1020;
      auVar41._0_8_ = local_1028;
      auVar41._16_8_ = dStack_1018;
      auVar41._24_8_ = dStack_1010;
      auVar63 = vmulpd_avx512vl(local_e68,auVar41);
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x20] = auVar63._0_8_ + auVar89._0_8_ + auVar62._0_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x21] = auVar63._8_8_ + auVar89._8_8_ + auVar62._8_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x22] = auVar63._16_8_ + auVar89._16_8_ + auVar62._16_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x23] = auVar63._24_8_ + auVar89._24_8_ + auVar62._24_8_;
      auVar89 = vmulpd_avx512vl(auVar85,auVar107);
      auVar67._8_8_ = dStack_d98;
      auVar67._0_8_ = local_da0;
      auVar67._16_8_ = dStack_d90;
      auVar67._24_8_ = dStack_d88;
      auVar62 = vmulpd_avx512vl(auVar25,auVar67);
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x45] = local_d40._0_8_ * local_1088 + auVar62._0_8_ + auVar89._0_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x46] = local_d40._8_8_ * dStack_1080 + auVar62._8_8_ + auVar89._8_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x47] = local_d40._16_8_ * dStack_1078 + auVar62._16_8_ + auVar89._16_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x48] = local_d40._24_8_ * dStack_1070 + auVar62._24_8_ + auVar89._24_8_;
      auVar89 = vmulpd_avx512vl(auVar13,_local_1698);
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x49] = local_1068 * dVar114 + local_1228 * local_d80 + auVar89._0_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x4a] = dStack_1060 * dVar6 + dStack_1220 * dStack_d78 + auVar89._8_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x4b] = dStack_1058 * dVar109 + dStack_1218 * dStack_d70 + auVar89._16_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x4c] = dStack_1050 * dVar120 + dStack_1210 * dStack_d68 + auVar89._24_8_;
      auVar89 = vmulpd_avx512vl(auVar10,auVar27);
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x4d] = local_1028 * local_d00._0_8_ + local_dc0 * dVar99 + auVar89._0_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x4e] = dStack_1020 * local_d00._8_8_ + dStack_db8 * dVar101 + auVar89._8_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x4f] = dStack_1018 * local_d00._16_8_ + dStack_db0 * dVar102 + auVar89._16_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x50] = dStack_1010 * local_d00._24_8_ + dStack_da8 * dVar103 + auVar89._24_8_;
      auVar89 = vmulpd_avx512vl(auVar30,auVar107);
      auVar62 = vmulpd_avx512vl(auVar9,auVar25);
      auVar63 = vmulpd_avx512vl(local_bd8,auVar39);
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x72] = auVar63._0_8_ + auVar62._0_8_ + auVar89._0_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x73] = auVar63._8_8_ + auVar62._8_8_ + auVar89._8_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x74] = auVar63._16_8_ + auVar62._16_8_ + auVar89._16_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x75] = auVar63._24_8_ + auVar62._24_8_ + auVar89._24_8_;
      auVar89 = vmulpd_avx512vl(auVar34,_local_1698);
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x76] = dVar91 * local_1068 + dVar90 * local_1228 + auVar89._0_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x77] = dVar94 * dStack_1060 + dVar93 * dStack_1220 + auVar89._8_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x78] = dVar96 * dStack_1058 + dVar95 * dStack_1218 + auVar89._16_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x79] = dVar98 * dStack_1050 + dVar97 * dStack_1210 + auVar89._24_8_;
      auVar89 = vmulpd_avx512vl(auVar37,auVar61);
      auVar61 = vmulpd_avx512vl(auVar72,auVar27);
      auVar62 = vmulpd_avx512vl(local_b98,auVar41);
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x7a] = auVar62._0_8_ + auVar89._0_8_ + auVar61._0_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x7b] = auVar62._8_8_ + auVar89._8_8_ + auVar61._8_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x7c] = auVar62._16_8_ + auVar89._16_8_ + auVar61._16_8_;
      local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
      array[0x7d] = auVar62._24_8_ + auVar89._24_8_ + auVar61._24_8_;
      _local_15a8 = auVar60;
      if (((this->m_kGQ_Dv).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_rows == 3) &&
         ((this->m_kGQ_Dv).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          m_storage.m_cols == 1)) {
        pdVar49 = (this->m_kGQ_Dv).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_data;
        auVar8._8_8_ = 0;
        auVar8._0_8_ = dVar2;
        auVar56._8_8_ = 0;
        auVar56._0_8_ = local_e38 * local_a00 + local_cd0 * local_898 + local_b68 * local_730;
        auVar53 = vmulsd_avx512f(auVar8,auVar56);
        auVar54._8_8_ = 0;
        auVar54._0_8_ = local_e38 * local_e38 + local_cd0 * local_cd0 + local_b68 * local_b68 + -1.0
        ;
        auVar54 = vmulsd_avx512f(auVar54,ZEXT816(0x3fe0000000000000));
        auVar55 = vmovddup_avx512vl(auVar8);
        dVar114 = auVar55._0_8_;
        dVar116 = auVar55._8_8_;
        dVar103 = *pdVar49;
        dVar119 = pdVar49[1];
        dVar2 = pdVar49[2];
        auVar128._8_8_ = 0;
        auVar128._0_8_ = local_b50;
        auVar55._8_8_ = 0;
        auVar55._0_8_ = local_718;
        auVar55 = vmulsd_avx512f(auVar128,auVar55);
        auVar124._8_8_ = 0;
        auVar124._0_8_ = local_e20 * local_9e8 + local_cb8 * local_880;
        auVar55 = vaddsd_avx512f(auVar124,auVar55);
        auVar59._8_8_ = 0;
        auVar59._0_8_ = local_e20 * local_e20 + local_cb8 * local_cb8 + local_b50 * local_b50 + -1.0
        ;
        auVar56 = vmulsd_avx512f(auVar59,ZEXT816(0x3fe0000000000000));
        auVar55 = vmulsd_avx512f(auVar8,auVar55);
        auVar57._8_8_ = 0;
        auVar57._0_8_ = local_868;
        auVar130._8_8_ = 0;
        auVar130._0_8_ = local_ca0;
        auVar57 = vmulsd_avx512f(auVar130,auVar57);
        auVar129._8_8_ = 0;
        auVar129._0_8_ = local_e08 * local_9d0;
        auVar57 = vaddsd_avx512f(auVar129,auVar57);
        auVar58._8_8_ = 0;
        auVar58._0_8_ = local_700;
        auVar132._8_8_ = 0;
        auVar132._0_8_ = local_b38;
        auVar58 = vmulsd_avx512f(auVar132,auVar58);
        auVar57 = vaddsd_avx512f(auVar57,auVar58);
        auVar131._8_8_ = 0;
        auVar131._0_8_ = local_ca0;
        auVar58 = vmulsd_avx512f(auVar130,auVar131);
        auVar133._8_8_ = 0;
        auVar133._0_8_ = local_b38;
        auVar59 = vmulsd_avx512f(auVar132,auVar133);
        auVar105._8_8_ = 0;
        auVar105._0_8_ = local_e08 * local_e08 + auVar58._0_8_ + auVar59._0_8_ + -1.0;
        auVar58 = vmulsd_avx512f(auVar105,ZEXT816(0x3fe0000000000000));
        auVar57 = vmulsd_avx512f(auVar8,auVar57);
        peVar3 = (this->m_material).
                 super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        p_Var4 = (this->m_material).
                 super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
          }
        }
        dVar109 = dVar103 * ((local_e48 * local_e48 + local_ce0 * local_ce0 + local_b78 * local_b78
                             + -1.0) * 0.5 +
                            dVar114 * (local_e48 * local_a10 + local_ce0 * local_8a8 +
                                      local_b78 * local_740));
        dVar112 = dVar119 * ((dStack_e40 * dStack_e40 + dStack_cd8 * dStack_cd8 +
                              dStack_b70 * dStack_b70 + -1.0) * 0.5 +
                            dVar116 * (dStack_e40 * dStack_a08 + dStack_cd8 * dStack_8a0 +
                                      dStack_b70 * dStack_738));
        dVar6 = (auVar53._0_8_ + auVar54._0_8_) * dVar2;
        dVar120 = ((local_e30 * local_e30 + local_cc8 * local_cc8 + local_b60 * local_b60 + -1.0) *
                   0.5 + (local_e30 * local_9f8 + local_cc8 * local_890 + local_b60 * local_728) *
                         dVar114) * dVar103;
        dVar121 = ((dStack_e28 * dStack_e28 + dStack_cc0 * dStack_cc0 + dStack_b58 * dStack_b58 +
                   -1.0) * 0.5 +
                  (dStack_e28 * dStack_9f0 + dStack_cc0 * dStack_888 + dStack_b58 * dStack_720) *
                  dVar116) * dVar119;
        dVar7 = (auVar55._0_8_ + auVar56._0_8_) * dVar2;
        dVar103 = dVar103 * ((local_e18 * local_e18 + local_cb0 * local_cb0 + local_b48 * local_b48
                             + -1.0) * 0.5 +
                            (local_e18 * local_9e0 + local_cb0 * local_878 + local_b48 * local_710)
                            * dVar114);
        dVar119 = dVar119 * ((dStack_e10 * dStack_e10 + dStack_ca8 * dStack_ca8 +
                              dStack_b40 * dStack_b40 + -1.0) * 0.5 +
                            (dStack_e10 * dStack_9d8 + dStack_ca8 * dStack_870 +
                            dStack_b40 * dStack_708) * dVar116);
        dVar2 = dVar2 * (auVar57._0_8_ + auVar58._0_8_);
        auVar53 = *(undefined1 (*) [16])
                   (peVar3->m_Dv).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                   m_storage.m_data.array;
        auVar55 = *(undefined1 (*) [16])
                   ((long)(peVar3->m_Dv).
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array + 0x10);
        auVar57 = *(undefined1 (*) [16])
                   ((long)(peVar3->m_Dv).
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array + 0x20);
        auVar58 = *(undefined1 (*) [16])
                   ((long)(peVar3->m_Dv).
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array + 0x30);
        dVar114 = *(double *)
                   ((long)(peVar3->m_Dv).
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array + 0x40);
        local_1678 = auVar53._0_8_;
        local_1658 = auVar55._0_8_;
        local_1638 = auVar57._0_8_;
        local_1798 = auVar58._0_8_;
        if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
        }
        auVar8 = vshufpd_avx(auVar53,auVar53,1);
        auVar53 = vshufpd_avx(auVar53,auVar53,3);
        local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x7e] = dVar109 * local_1678 + dVar120 * auVar53._0_8_ + dVar103 * local_1658;
        local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x7f] = dVar112 * local_1678 + dVar121 * auVar53._8_8_ + dVar119 * local_1658;
        local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x80] = dVar6 * local_1678 + dVar7 * auVar8._0_8_ + dVar2 * local_1658;
        auVar53 = vshufpd_avx(auVar55,auVar55,1);
        auVar8 = vshufpd_avx(auVar57,auVar57,1);
        auVar55 = vshufpd_avx(auVar55,auVar55,3);
        auVar57 = vshufpd_avx(auVar57,auVar57,3);
        local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x81] = dVar103 * auVar57._0_8_ + dVar109 * auVar55._0_8_ + dVar120 * local_1638;
        local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x82] = dVar119 * auVar57._8_8_ + dVar112 * auVar55._8_8_ + dVar121 * local_1638;
        local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x83] = dVar2 * auVar8._0_8_ + dVar6 * auVar53._0_8_ + dVar7 * local_1638;
        auVar53 = vshufpd_avx(auVar58,auVar58,1);
        auVar55 = vshufpd_avx(auVar58,auVar58,3);
        local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x84] = dVar109 * local_1798 + dVar120 * auVar55._0_8_ + dVar103 * dVar114;
        local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x85] = dVar112 * local_1798 + dVar121 * auVar55._8_8_ + dVar119 * dVar114;
        local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x86] = dVar2 * dVar114 + local_1798 * dVar6 + dVar7 * auVar53._0_8_;
        local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x24] = local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x7e] * local_e48;
        local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x25] = local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x7f] * dStack_e40;
        local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x26] = local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x80] * local_e38;
        local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x51] = local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x7e] * local_ce0;
        local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x52] = local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x7f] * dStack_cd8;
        local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x53] = local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x80] * local_cd0;
        local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x7e] = local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x7e] * local_b78;
        local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x7f] = local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x7f] * dStack_b70;
        local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x80] = local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x80] * local_b68;
        local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x27] = local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x81] * local_e30;
        local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x28] = local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x82] * dStack_e28;
        local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x29] = local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x83] * local_e20;
        local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x54] = local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x81] * local_cc8;
        local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x55] = local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x82] * dStack_cc0;
        local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x56] = local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x83] * local_cb8;
        local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x81] = local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x81] * local_b60;
        local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x82] = local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x82] * dStack_b58;
        local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x83] = local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x83] * local_b50;
        local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x2a] = local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x84] * local_e18;
        local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x2b] = local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x85] * dStack_e10;
        local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x2c] = local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x86] * local_e08;
        local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x57] = local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x84] * local_cb0;
        local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x58] = local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x85] * dStack_ca8;
        local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x59] = local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x86] * local_ca0;
        local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x84] = local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x84] * local_b48;
        local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x85] = local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x85] * dStack_b40;
        local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.m_storage.m_data.
        array[0x86] = local_6f0.super_PlainObjectBase<Eigen::Matrix<double,_45,_3,_0,_45,_3>_>.
                      m_storage.m_data.array[0x86] * local_b38;
        if ((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
            m_cols != 0x2d) {
          pcVar50 = 
          "Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Matrix<double, 45, 3, 0>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1, 1>, Rhs = Eigen::Matrix<double, 45, 3, 0>, Option = 0]"
          ;
          goto LAB_00737a89;
        }
        if ((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
            m_rows == 9) {
          local_2b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[0x18] = 0.0;
          local_2b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[0x19] = 0.0;
          local_2b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[0x1a] = 0.0;
          local_2b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[0x10] = 0.0;
          local_2b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[0x11] = 0.0;
          local_2b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[0x12] = 0.0;
          local_2b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[0x13] = 0.0;
          local_2b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[0x14] = 0.0;
          local_2b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[0x15] = 0.0;
          local_2b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[0x16] = 0.0;
          local_2b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[0x17] = 0.0;
          local_2b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[8] = 0.0;
          local_2b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[9] = 0.0;
          local_2b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[10] = 0.0;
          local_2b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[0xb] = 0.0;
          local_2b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[0xc] = 0.0;
          local_2b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[0xd] = 0.0;
          local_2b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[0xe] = 0.0;
          local_2b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[0xf] = 0.0;
          local_2b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[0] = 0.0;
          local_2b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[1] = 0.0;
          local_2b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[2] = 0.0;
          local_2b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[3] = 0.0;
          local_2b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[4] = 0.0;
          local_2b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[5] = 0.0;
          local_2b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[6] = 0.0;
          local_2b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
          array[7] = 0.0;
          local_15f0 = 1.0;
          Eigen::internal::
          generic_product_impl<Eigen::Matrix<double,-1,-1,1,-1,-1>,Eigen::Matrix<double,45,3,0,45,3>,Eigen::DenseShape,Eigen::DenseShape,8>
          ::scaleAndAddTo<Eigen::Matrix<double,9,3,1,9,3>>(&local_2b8,a_lhs,&local_6f0,&local_15f0);
          if ((Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
              != 0x1b) {
            pdVar49 = (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                      .m_data;
            if (pdVar49 != (double *)0x0) {
              free((void *)pdVar49[-1]);
            }
            pvVar47 = malloc(0x118);
            if (pvVar47 == (void *)0x0) {
              pdVar49 = (double *)0x0;
            }
            else {
              *(void **)(((ulong)pvVar47 & 0xffffffffffffffc0) + 0x38) = pvVar47;
              pdVar49 = (double *)(((ulong)pvVar47 & 0xffffffffffffffc0) + 0x40);
            }
            if (pdVar49 == (double *)0x0) {
              puVar48 = (undefined8 *)__cxa_allocate_exception(8);
              *puVar48 = std::ostream::_M_insert<bool>;
              __cxa_throw(puVar48,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
            }
            (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
                 pdVar49;
            (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows =
                 0x1b;
          }
          if ((Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
              == 0x1b) {
            pdVar49 = (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                      .m_data;
            uVar51 = 0xfffffffffffffff8;
            do {
              dVar2 = local_2b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.
                      m_storage.m_data.array[uVar51 + 9];
              dVar103 = local_2b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.
                        m_storage.m_data.array[uVar51 + 10];
              dVar119 = local_2b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.
                        m_storage.m_data.array[uVar51 + 0xb];
              dVar114 = local_2b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.
                        m_storage.m_data.array[uVar51 + 0xc];
              dVar116 = local_2b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.
                        m_storage.m_data.array[uVar51 + 0xd];
              dVar6 = local_2b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.
                      m_storage.m_data.array[uVar51 + 0xe];
              dVar7 = local_2b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.
                      m_storage.m_data.array[uVar51 + 0xf];
              pdVar1 = pdVar49 + uVar51 + 8;
              *pdVar1 = local_2b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.
                        m_storage.m_data.array[uVar51 + 8];
              pdVar1[1] = dVar2;
              pdVar1[2] = dVar103;
              pdVar1[3] = dVar119;
              pdVar1[4] = dVar114;
              pdVar1[5] = dVar116;
              pdVar1[6] = dVar6;
              pdVar1[7] = dVar7;
              uVar51 = uVar51 + 8;
            } while (uVar51 < 0x10);
            lVar52 = 0x18;
            do {
              pdVar49[lVar52] =
                   local_2b8.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.
                   m_data.array[lVar52];
              lVar52 = lVar52 + 1;
            } while (lVar52 != 0x1b);
            return;
          }
          __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                        "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                        "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Map<Eigen::Matrix<double, 27, 1>>, T1 = double, T2 = double]"
                       );
        }
        pcVar50 = 
        "void Eigen::PlainObjectBase<Eigen::Matrix<double, 9, 3, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 9, 3, 1>]"
        ;
        goto LAB_00737aab;
      }
      pcVar50 = 
      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::ArrayWrapper<Eigen::Matrix<double, 3, 1>>, SrcXprType = Eigen::ArrayWrapper<Eigen::Matrix<double, -1, -1>>, Functor = Eigen::internal::mul_assign_op<double>]"
      ;
    }
    else {
      pcVar50 = 
      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::ArrayWrapper<Eigen::Matrix<double, 12, 1>>, SrcXprType = Eigen::ArrayWrapper<Eigen::Matrix<double, -1, -1>>, Functor = Eigen::internal::mul_assign_op<double>]"
      ;
    }
    __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                  "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,pcVar50);
  }
  pcVar50 = 
  "void Eigen::PlainObjectBase<Eigen::Matrix<double, 45, 6, 0>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 45, 6, 0>]"
  ;
LAB_00737aab:
  __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,pcVar50);
}

Assistant:

void ChElementBeamANCF_3333::ComputeInternalForcesContIntDamping(ChVectorDynamic<>& Fi) {
    // Calculate the generalize internal force vector using the "Continuous Integration" style of method assuming a
    // linear viscoelastic material model (single term damping model).  For this style of method, the generalized
    // internal force vector is integrated across the volume of the element every time this calculation is performed.
    // For this element, this is likely more efficient than the "Pre-Integration" style calculation method.  Note that
    // the integrand for the generalize internal force vector for a straight and normalized element is of order : 8 in
    // xi, 4 in eta, and 4 in zeta. This requires GQ 5 points along the xi direction and 3 GQ points along the eta and
    // zeta directions for "Full Integration". However, very similar results can be obtained with fewer GQ point in each
    // direction, resulting in significantly fewer calculations.  Based on testing, this could be as low as 3x2x2

    MatrixNx6 ebar_ebardot;
    CalcCombinedCoordMatrix(ebar_ebardot);

    // =============================================================================
    // Calculate the deformation gradient and time derivative of the deformation gradient for all Gauss quadrature
    // points in a single matrix multiplication.  Note that since the shape function derivative matrix is ordered by
    // columns, the resulting deformation gradient will be ordered by block matrix (column vectors) components
    // Note that the indices of the components are in transposed order
    //      [F11  F21  F31  F11dot  F21dot  F31dot ] <-- D0 Block (No Poisson Effect)
    //      [F12  F22  F32  F12dot  F22dot  F32dot ] <-- D0 Block (No Poisson Effect)
    // FC = [F13  F23  F33  F13dot  F23dot  F33dot ] <-- D0 Block (No Poisson Effect)
    //      [F11  F21  F31  F11dot  F21dot  F31dot ] <-- Dv Block (With Poisson Effect)
    //      [F12  F22  F32  F12dot  F22dot  F32dot ] <-- Dv Block (With Poisson Effect)
    //      [F13  F23  F33  F13dot  F23dot  F33dot ] <-- Dv Block (With Poisson Effect)
    // =============================================================================

    ChMatrixNMc<double, 3 * NIP, 6> FC = m_SD.transpose() * ebar_ebardot;

    // =============================================================================
    // =============================================================================
    // Since the Enhanced Continuum Mechanics method is utilized for this element, first calculate the contribution to
    // the generalized internal force vector from the terms that do not include the Poisson effect.  This is integrated
    // across the entire volume of the element using the full number of Gauss quadrature points.
    // =============================================================================
    // =============================================================================

    // =============================================================================
    // Get the diagonal terms of the 6x6 matrix (does not include the Poisson effect)
    // =============================================================================
    const ChVectorN<double, 6>& D0 = GetMaterial()->Get_D0();

    // =============================================================================
    // Calculate each individual value of the Green-Lagrange strain component by component across all the
    // Gauss-Quadrature points at a time to better leverage vectorized CPU instructions.
    // Note that the scaled time derivatives of the Green-Lagrange strain are added to make the calculation of
    // the 2nd Piola-Kirchoff stresses more efficient.  The combined result is then scaled by minus the Gauss
    // quadrature weight times the element Jacobian at the corresponding Gauss point (m_kGQ) again for efficiency.
    // Since only the diagonal terms in the 6x6 stiffness matrix are used, the 2nd Piola-Kirchoff can be calculated by
    // simply scaling the vector of scaled Green-Lagrange strains in Voight notation by the corresponding diagonal entry
    // in the stiffness matrix.
    // Results are written in Voigt notation: epsilon = [E11,E22,E33,2*E23,2*E13,2*E12]
    //  kGQ*SPK2 = kGQ*[SPK2_11,SPK2_22,SPK2_33,SPK2_23,SPK2_13,SPK2_12] = D * E_Combined
    // =============================================================================

    // Each entry in SPK2_1 = D11*kGQ*(E11+alpha*E11dot)
    //     = D11*kGQ*(1/2*(F11*F11+F21*F21+F31*F31-1)+alpha*(F11*F11dot+F21*F21dot+F31*F31dot))
    VectorNIP_D0 E_BlockDamping_D0 =
        FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(0, 3)) +
        FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(0, 4)) +
        FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(0, 5));
    VectorNIP_D0 SPK2_1_Block_D0 = FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(0, 0)) +
                                   FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(0, 1)) +
                                   FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(0, 2));
    SPK2_1_Block_D0.array() -= 1;
    SPK2_1_Block_D0 += (2 * m_Alpha) * E_BlockDamping_D0;
    SPK2_1_Block_D0.array() *= m_kGQ_D0.array();
    SPK2_1_Block_D0 *= (0.5 * D0(0));

    // Each entry in SPK2_2 = D22*kGQ*(E22+alpha*E22dot)
    //     = D22*kGQ*(1/2*(F12*F12+F22*F22+F32*F32-1)+alpha*(F12*F12dot+F22*F22dot+F32*F32dot))
    E_BlockDamping_D0.noalias() =
        FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 3)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 4)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 5));
    VectorNIP_D0 SPK2_2_Block_D0 =
        FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 0)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 1)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 2));
    SPK2_2_Block_D0.array() -= 1;
    SPK2_2_Block_D0 += (2 * m_Alpha) * E_BlockDamping_D0;
    SPK2_2_Block_D0.array() *= m_kGQ_D0.array();
    SPK2_2_Block_D0 *= (0.5 * D0(1));

    // Each entry in SPK2_3 = D33*kGQ*(E33+alpha*E33dot)
    //     = D33*kGQ*(1/2*(F13*F13+F23*F23+F33*F33-1)+alpha*(F13*F13dot+F23*F23dot+F33*F33dot))
    E_BlockDamping_D0.noalias() =
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 3)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 4)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 5));
    VectorNIP_D0 SPK2_3_Block_D0 =
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 0)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 1)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 2));
    SPK2_3_Block_D0.array() -= 1;
    SPK2_3_Block_D0 += (2 * m_Alpha) * E_BlockDamping_D0;
    SPK2_3_Block_D0.array() *= m_kGQ_D0.array();
    SPK2_3_Block_D0 *= (0.5 * D0(2));

    // Each entry in SPK2_4 = D44*kGQ*(2*(E23+alpha*E23dot))
    //     = D44*kGQ*((F12*F13+F22*F23+F32*F33)
    //       +alpha*(F12dot*F13+F22dot*F23+F32dot*F33 + F12*F13dot+F22*F23dot+F32*F33dot))
    E_BlockDamping_D0.noalias() =
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 3)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 4)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 5)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 3)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 4)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 5));
    VectorNIP_D0 SPK2_4_Block_D0 =
        FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 0)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 1)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 2));
    SPK2_4_Block_D0 += m_Alpha * E_BlockDamping_D0;
    SPK2_4_Block_D0.array() *= m_kGQ_D0.array();
    SPK2_4_Block_D0 *= D0(3);

    // Each entry in SPK2_5 = D55*kGQ*(2*(E13+alpha*E13dot))
    //     = D55*kGQ*((F11*F13+F21*F23+F31*F33)
    //       +alpha*(F11dot*F13+F21dot*F23+F31dot*F33 + F11*F13dot+F21*F23dot+F31*F33dot))
    E_BlockDamping_D0.noalias() =
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(0, 3)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(0, 4)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(0, 5)) +
        FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 3)) +
        FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 4)) +
        FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 5));
    VectorNIP_D0 SPK2_5_Block_D0 =
        FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 0)) +
        FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 1)) +
        FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 2));
    SPK2_5_Block_D0 += m_Alpha * E_BlockDamping_D0;
    SPK2_5_Block_D0.array() *= m_kGQ_D0.array();
    SPK2_5_Block_D0 *= D0(4);

    // Each entry in SPK2_6 = D66*kGQ*(2*(E12+alpha*E12dot))
    //     = D66*kGQ*((F11*F12+F21*F22+F31*F32)
    //       +alpha*(F11dot*F12+F21dot*F22+F31dot*F32 + F11*F12dot+F21*F22dot+F31*F32dot))
    E_BlockDamping_D0.noalias() =
        FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(0, 3)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(0, 4)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(0, 5)) +
        FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 3)) +
        FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 4)) +
        FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 5));
    VectorNIP_D0 SPK2_6_Block_D0 =
        FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 0)) +
        FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 1)) +
        FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 2));
    SPK2_6_Block_D0 += m_Alpha * E_BlockDamping_D0;
    SPK2_6_Block_D0.array() *= m_kGQ_D0.array();
    SPK2_6_Block_D0 *= D0(5);

    // =============================================================================
    // Calculate the transpose of the 1st Piola-Kirchoff stresses in block tensor form whose entries have been
    // scaled by minus the Gauss quadrature weight times the element Jacobian at the corresponding Gauss point.
    // The entries are grouped by component in block matrices (column vectors)
    // P_Block = kGQ*P_transpose = kGQ*SPK2*F_transpose
    //           [kGQ*(P_transpose)_11  kGQ*(P_transpose)_12  kGQ*(P_transpose)_13 ] <-- D0 Block
    //           [kGQ*(P_transpose)_21  kGQ*(P_transpose)_22  kGQ*(P_transpose)_23 ] <-- D0 Block
    //         = [kGQ*(P_transpose)_31  kGQ*(P_transpose)_32  kGQ*(P_transpose)_33 ] <-- D0 Block
    //           [kGQ*(P_transpose)_11  kGQ*(P_transpose)_12  kGQ*(P_transpose)_13 ] <-- Dv Block
    //           [kGQ*(P_transpose)_21  kGQ*(P_transpose)_22  kGQ*(P_transpose)_23 ] <-- Dv Block
    //           [kGQ*(P_transpose)_31  kGQ*(P_transpose)_32  kGQ*(P_transpose)_33 ] <-- Dv Block
    // Note that the Dv Block entries will be calculated separately in a later step.
    // =============================================================================

    ChMatrixNMc<double, 3 * NIP, 3> P_Block;

    P_Block.template block<NIP_D0, 1>(0, 0) = FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(SPK2_1_Block_D0) +
                                              FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(SPK2_6_Block_D0) +
                                              FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).cwiseProduct(SPK2_5_Block_D0);
    P_Block.template block<NIP_D0, 1>(0, 1) = FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(SPK2_1_Block_D0) +
                                              FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(SPK2_6_Block_D0) +
                                              FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).cwiseProduct(SPK2_5_Block_D0);
    P_Block.template block<NIP_D0, 1>(0, 2) = FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(SPK2_1_Block_D0) +
                                              FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(SPK2_6_Block_D0) +
                                              FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).cwiseProduct(SPK2_5_Block_D0);

    P_Block.template block<NIP_D0, 1>(NIP_D0, 0) =
        FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(SPK2_6_Block_D0) +
        FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(SPK2_2_Block_D0) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).cwiseProduct(SPK2_4_Block_D0);
    P_Block.template block<NIP_D0, 1>(NIP_D0, 1) =
        FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(SPK2_6_Block_D0) +
        FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(SPK2_2_Block_D0) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).cwiseProduct(SPK2_4_Block_D0);
    P_Block.template block<NIP_D0, 1>(NIP_D0, 2) =
        FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(SPK2_6_Block_D0) +
        FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(SPK2_2_Block_D0) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).cwiseProduct(SPK2_4_Block_D0);

    P_Block.template block<NIP_D0, 1>(2 * NIP_D0, 0) =
        FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(SPK2_5_Block_D0) +
        FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(SPK2_4_Block_D0) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).cwiseProduct(SPK2_3_Block_D0);
    P_Block.template block<NIP_D0, 1>(2 * NIP_D0, 1) =
        FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(SPK2_5_Block_D0) +
        FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(SPK2_4_Block_D0) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).cwiseProduct(SPK2_3_Block_D0);
    P_Block.template block<NIP_D0, 1>(2 * NIP_D0, 2) =
        FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(SPK2_5_Block_D0) +
        FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(SPK2_4_Block_D0) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).cwiseProduct(SPK2_3_Block_D0);

    // =============================================================================
    // =============================================================================
    // Since the Enhanced Continuum Mechanics method is utilized for this element, second calculate the contribution to
    // the generalized internal force vector from the terms that include the Poisson effect.  This is integrated
    // across the entire volume of the element using Gauss quadrature points only along the beam axis.  It is assumed
    // that an isotropic material or orthotropic material aligned with its principle axes is used
    // =============================================================================
    // =============================================================================

    // =============================================================================
    // Calculate each individual value of the Green-Lagrange strain component by component across all the
    // Gauss-Quadrature points at a time to better leverage vectorized CPU instructions.
    // Note that the scaled time derivatives of the Green-Lagrange strain are added to make the later calculation of
    // the 2nd Piola-Kirchoff stresses more efficient.  The combined result is then scaled by minus the Gauss
    // quadrature weight times the element Jacobian at the corresponding Gauss point (m_kGQ) again for efficiency.
    // Results are written in Voigt notation: epsilon = [E11,E22,E33,2*E23,2*E13,2*E12]
    // Note that with the material assumption being used, only [E11,E22,E33] need to be calculated
    // =============================================================================

    // Each entry in E1 = kGQ*(E11+alpha*E11dot)
    //                  = kGQ*(1/2*(F11*F11+F21*F21+F31*F31-1)+alpha*(F11*F11dot+F21*F21dot+F31*F31dot))
    VectorNIP_Dv E_BlockDamping_Dv =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 0).cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 3)) +
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 1).cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 4)) +
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 2).cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 5));
    VectorNIP_Dv E1_Block_Dv =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 0).cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 0)) +
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 1).cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 1)) +
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 2).cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 2));
    E1_Block_Dv.array() -= 1;
    E1_Block_Dv *= 0.5;
    E1_Block_Dv += m_Alpha * E_BlockDamping_Dv;
    E1_Block_Dv.array() *= m_kGQ_Dv.array();

    // Each entry in E2 = kGQ*(E22+alpha*E22dot)
    //                  = kGQ*(1/2*(F12*F12+F22*F22+F32*F32-1)+alpha*(F12*F12dot+F22*F22dot+F32*F32dot))
    E_BlockDamping_Dv.noalias() = FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 0)
                                      .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 3)) +
                                  FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 1)
                                      .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 4)) +
                                  FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 2)
                                      .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 5));
    VectorNIP_Dv E2_Block_Dv = FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 0)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 0)) +
                               FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 1)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 1)) +
                               FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 2)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 2));
    E2_Block_Dv.array() -= 1;
    E2_Block_Dv *= 0.5;
    E2_Block_Dv += m_Alpha * E_BlockDamping_Dv;
    E2_Block_Dv.array() *= m_kGQ_Dv.array();

    // Each entry in E3 = kGQ*(E33+alpha*E33dot)
    //                  = kGQ*(1/2*(F13*F13+F23*F23+F33*F33-1)+alpha*(F13*F13dot+F23*F23dot+F33*F33dot))
    E_BlockDamping_Dv.noalias() = FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 0)
                                      .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 3)) +
                                  FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 1)
                                      .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 4)) +
                                  FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 2)
                                      .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 5));
    VectorNIP_Dv E3_Block_Dv = FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 0)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 0)) +
                               FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 1)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 1)) +
                               FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 2)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 2));
    E3_Block_Dv.array() -= 1;
    E3_Block_Dv *= 0.5;
    E3_Block_Dv += m_Alpha * E_BlockDamping_Dv;
    E3_Block_Dv.array() *= m_kGQ_Dv.array();

    // =============================================================================
    // Get the upper 3x3 block of the stiffness tensor in 6x6 matrix that accounts for the Poisson effect.  Note that
    // with the split of the stiffness matrix and the assumed materials, the entries in the 6x6 stiffness matrix outside
    // of the upper 3x3 block are all zeros.
    // =============================================================================

    const ChMatrix33<double>& Dv = GetMaterial()->Get_Dv();

    // =============================================================================
    // Calculate the 2nd Piola-Kirchoff stresses in Voigt notation across all the Gauss quadrature points at a time
    // component by component. Note that the Green-Largrange strain components have been scaled and already been
    // combined with their scaled time derivatives and minus the Gauss quadrature weight times the element Jacobian at
    // the corresponding Gauss point to make the calculation of the 2nd Piola-Kirchoff stresses more efficient.
    //  kGQ*SPK2 = kGQ*[SPK2_11,SPK2_22,SPK2_33,SPK2_23,SPK2_13,SPK2_12] = D * E_Combined
    // =============================================================================

    VectorNIP_Dv SPK2_1_Block_Dv = Dv(0, 0) * E1_Block_Dv + Dv(0, 1) * E2_Block_Dv + Dv(0, 2) * E3_Block_Dv;
    VectorNIP_Dv SPK2_2_Block_Dv = Dv(1, 0) * E1_Block_Dv + Dv(1, 1) * E2_Block_Dv + Dv(1, 2) * E3_Block_Dv;
    VectorNIP_Dv SPK2_3_Block_Dv = Dv(2, 0) * E1_Block_Dv + Dv(2, 1) * E2_Block_Dv + Dv(2, 2) * E3_Block_Dv;

    // =============================================================================
    // Calculate the transpose of the 1st Piola-Kirchoff stresses in block tensor form whose entries have been
    // scaled by minus the Gauss quadrature weight times the element Jacobian at the corresponding Gauss point.
    // The entries are grouped by component in block matrices (column vectors)
    // P_Block = kGQ*P_transpose = kGQ*SPK2*F_transpose
    //           [kGQ*(P_transpose)_11  kGQ*(P_transpose)_12  kGQ*(P_transpose)_13 ] <-- D0 Block
    //           [kGQ*(P_transpose)_21  kGQ*(P_transpose)_22  kGQ*(P_transpose)_23 ] <-- D0 Block
    //         = [kGQ*(P_transpose)_31  kGQ*(P_transpose)_32  kGQ*(P_transpose)_33 ] <-- D0 Block
    //           [kGQ*(P_transpose)_11  kGQ*(P_transpose)_12  kGQ*(P_transpose)_13 ] <-- Dv Block
    //           [kGQ*(P_transpose)_21  kGQ*(P_transpose)_22  kGQ*(P_transpose)_23 ] <-- Dv Block
    //           [kGQ*(P_transpose)_31  kGQ*(P_transpose)_32  kGQ*(P_transpose)_33 ] <-- Dv Block
    // Note that the D0 Block entries have already been calculated above
    // =============================================================================

    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 0) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 0).cwiseProduct(SPK2_1_Block_Dv);
    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 1) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 1).cwiseProduct(SPK2_1_Block_Dv);
    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 2) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 2).cwiseProduct(SPK2_1_Block_Dv);

    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 0) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 0).cwiseProduct(SPK2_2_Block_Dv);
    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 1) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 1).cwiseProduct(SPK2_2_Block_Dv);
    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 2) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 2).cwiseProduct(SPK2_2_Block_Dv);

    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 0) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 0).cwiseProduct(SPK2_3_Block_Dv);
    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 1) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 1).cwiseProduct(SPK2_3_Block_Dv);
    P_Block.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 2) =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 2).cwiseProduct(SPK2_3_Block_Dv);

    // =============================================================================
    // Multiply the scaled first Piola-Kirchoff stresses by the shape function derivative matrix to get the generalized
    // force vector in matrix form (in the correct order if its calculated in row-major memory layout)
    // =============================================================================

    MatrixNx3 QiCompact = m_SD * P_Block;

    // =============================================================================
    // Reshape the compact matrix form of the generalized internal force vector (stored using a row-major memory layout)
    // into its actual column vector format.  This is done by mathematically stacking the transpose of each row on top
    // of each other forming the column vector.  Due to the memory organization this is simply a reinterpretation of the
    // data
    // =============================================================================

    Eigen::Map<Vector3N> QiReshaped(QiCompact.data(), QiCompact.size());
    Fi = QiReshaped;
}